

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  byte bVar90;
  int iVar91;
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  long lVar95;
  ulong uVar96;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar97;
  byte bVar98;
  ulong uVar99;
  undefined4 uVar100;
  undefined8 in_R11;
  bool bVar101;
  float fVar102;
  undefined8 uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar132;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar105 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar237;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar188 [32];
  float fVar193;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar212;
  float fVar220;
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar222;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar226;
  float fVar235;
  float fVar236;
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [64];
  float fVar241;
  undefined1 auVar246 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar247 [64];
  float fVar248;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar255;
  float fVar256;
  undefined1 auVar251 [32];
  float fVar257;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [28];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar266 [32];
  undefined1 auVar264 [16];
  undefined1 auVar267 [32];
  undefined1 auVar265 [16];
  undefined1 auVar268 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [64];
  float s;
  undefined1 auVar279 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ce4;
  undefined1 local_ce0 [32];
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  uint uStack_b84;
  float local_b80;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  undefined4 local_ae0;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [16];
  Primitive *local_998;
  ulong local_990;
  ulong local_988;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  uint local_740;
  uint uStack_73c;
  uint uStack_738;
  uint uStack_734;
  uint uStack_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar278 [64];
  
  PVar8 = prim[1];
  uVar94 = (ulong)(byte)PVar8;
  fVar102 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar104._0_4_ = fVar102 * auVar11._0_4_;
  auVar104._4_4_ = fVar102 * auVar11._4_4_;
  auVar104._8_4_ = fVar102 * auVar11._8_4_;
  auVar104._12_4_ = fVar102 * auVar11._12_4_;
  auVar213._0_4_ = fVar102 * auVar12._0_4_;
  auVar213._4_4_ = fVar102 * auVar12._4_4_;
  auVar213._8_4_ = fVar102 * auVar12._8_4_;
  auVar213._12_4_ = fVar102 * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar94 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar11);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar94 * 5 + 6);
  auVar274 = vpmovsxbd_avx2(auVar12);
  auVar274 = vcvtdq2ps_avx(auVar274);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar94 * 6 + 6);
  auVar119 = vpmovsxbd_avx2(auVar1);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar174 = vpmovsxbd_avx2(auVar2);
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar94 * 0xc + 6);
  auVar13 = vpmovsxbd_avx2(auVar3);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 6);
  auVar124 = vpmovsxbd_avx2(auVar4);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 6);
  auVar288 = vpmovsxbd_avx2(auVar5);
  auVar288 = vcvtdq2ps_avx(auVar288);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar94 * 0x13 + 6);
  auVar230 = vpmovsxbd_avx2(auVar6);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar94 * 0x14 + 6);
  auVar14 = vpmovsxbd_avx2(auVar7);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar286._4_4_ = auVar213._0_4_;
  auVar286._0_4_ = auVar213._0_4_;
  auVar286._8_4_ = auVar213._0_4_;
  auVar286._12_4_ = auVar213._0_4_;
  auVar286._16_4_ = auVar213._0_4_;
  auVar286._20_4_ = auVar213._0_4_;
  auVar286._24_4_ = auVar213._0_4_;
  auVar286._28_4_ = auVar213._0_4_;
  auVar11 = vmovshdup_avx(auVar213);
  uVar103 = auVar11._0_8_;
  auVar293._8_8_ = uVar103;
  auVar293._0_8_ = uVar103;
  auVar293._16_8_ = uVar103;
  auVar293._24_8_ = uVar103;
  auVar11 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar102 = auVar11._0_4_;
  auVar155._0_4_ = fVar102 * auVar119._0_4_;
  fVar132 = auVar11._4_4_;
  auVar155._4_4_ = fVar132 * auVar119._4_4_;
  auVar155._8_4_ = fVar102 * auVar119._8_4_;
  auVar155._12_4_ = fVar132 * auVar119._12_4_;
  auVar155._16_4_ = fVar102 * auVar119._16_4_;
  auVar155._20_4_ = fVar132 * auVar119._20_4_;
  auVar155._28_36_ = in_ZMM10._28_36_;
  auVar155._24_4_ = fVar102 * auVar119._24_4_;
  auVar269._0_4_ = auVar124._0_4_ * fVar102;
  auVar269._4_4_ = auVar124._4_4_ * fVar132;
  auVar269._8_4_ = auVar124._8_4_ * fVar102;
  auVar269._12_4_ = auVar124._12_4_ * fVar132;
  auVar269._16_4_ = auVar124._16_4_ * fVar102;
  auVar269._20_4_ = auVar124._20_4_ * fVar132;
  auVar269._28_36_ = in_ZMM9._28_36_;
  auVar269._24_4_ = auVar124._24_4_ * fVar102;
  auVar251._0_4_ = auVar14._0_4_ * fVar102;
  auVar251._4_4_ = auVar14._4_4_ * fVar132;
  auVar251._8_4_ = auVar14._8_4_ * fVar102;
  auVar251._12_4_ = auVar14._12_4_ * fVar132;
  auVar251._16_4_ = auVar14._16_4_ * fVar102;
  auVar251._20_4_ = auVar14._20_4_ * fVar132;
  auVar251._24_4_ = auVar14._24_4_ * fVar102;
  auVar251._28_4_ = 0;
  auVar11 = vfmadd231ps_fma(auVar155._0_32_,auVar293,auVar274);
  auVar12 = vfmadd231ps_fma(auVar269._0_32_,auVar293,auVar13);
  auVar1 = vfmadd231ps_fma(auVar251,auVar230,auVar293);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar286,auVar115);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar286,auVar174);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar288,auVar286);
  auVar287._4_4_ = auVar104._0_4_;
  auVar287._0_4_ = auVar104._0_4_;
  auVar287._8_4_ = auVar104._0_4_;
  auVar287._12_4_ = auVar104._0_4_;
  auVar287._16_4_ = auVar104._0_4_;
  auVar287._20_4_ = auVar104._0_4_;
  auVar287._24_4_ = auVar104._0_4_;
  auVar287._28_4_ = auVar104._0_4_;
  auVar11 = vmovshdup_avx(auVar104);
  uVar103 = auVar11._0_8_;
  auVar294._8_8_ = uVar103;
  auVar294._0_8_ = uVar103;
  auVar294._16_8_ = uVar103;
  auVar294._24_8_ = uVar103;
  auVar11 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar102 = auVar11._0_4_;
  auVar120._0_4_ = fVar102 * auVar119._0_4_;
  fVar132 = auVar11._4_4_;
  auVar120._4_4_ = fVar132 * auVar119._4_4_;
  auVar120._8_4_ = fVar102 * auVar119._8_4_;
  auVar120._12_4_ = fVar132 * auVar119._12_4_;
  auVar120._16_4_ = fVar102 * auVar119._16_4_;
  auVar120._20_4_ = fVar132 * auVar119._20_4_;
  auVar120._24_4_ = fVar102 * auVar119._24_4_;
  auVar120._28_4_ = 0;
  auVar245._4_4_ = auVar124._4_4_ * fVar132;
  auVar245._0_4_ = auVar124._0_4_ * fVar102;
  auVar245._8_4_ = auVar124._8_4_ * fVar102;
  auVar245._12_4_ = auVar124._12_4_ * fVar132;
  auVar245._16_4_ = auVar124._16_4_ * fVar102;
  auVar245._20_4_ = auVar124._20_4_ * fVar132;
  auVar245._24_4_ = auVar124._24_4_ * fVar102;
  auVar245._28_4_ = auVar119._28_4_;
  auVar119._4_4_ = auVar14._4_4_ * fVar132;
  auVar119._0_4_ = auVar14._0_4_ * fVar102;
  auVar119._8_4_ = auVar14._8_4_ * fVar102;
  auVar119._12_4_ = auVar14._12_4_ * fVar132;
  auVar119._16_4_ = auVar14._16_4_ * fVar102;
  auVar119._20_4_ = auVar14._20_4_ * fVar132;
  auVar119._24_4_ = auVar14._24_4_ * fVar102;
  auVar119._28_4_ = fVar132;
  auVar11 = vfmadd231ps_fma(auVar120,auVar294,auVar274);
  auVar3 = vfmadd231ps_fma(auVar245,auVar294,auVar13);
  auVar4 = vfmadd231ps_fma(auVar119,auVar294,auVar230);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar287,auVar115);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar287,auVar174);
  local_a80._8_4_ = 0x7fffffff;
  local_a80._0_8_ = 0x7fffffff7fffffff;
  local_a80._12_4_ = 0x7fffffff;
  local_a80._16_4_ = 0x7fffffff;
  local_a80._20_4_ = 0x7fffffff;
  local_a80._24_4_ = 0x7fffffff;
  local_a80._28_4_ = 0x7fffffff;
  auVar142._8_4_ = 0x219392ef;
  auVar142._0_8_ = 0x219392ef219392ef;
  auVar142._12_4_ = 0x219392ef;
  auVar142._16_4_ = 0x219392ef;
  auVar142._20_4_ = 0x219392ef;
  auVar142._24_4_ = 0x219392ef;
  auVar142._28_4_ = 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar2),local_a80);
  auVar115 = vcmpps_avx(auVar115,auVar142,1);
  auVar274 = vblendvps_avx(ZEXT1632(auVar2),auVar142,auVar115);
  auVar269 = ZEXT3264(local_a80);
  auVar115 = vandps_avx(ZEXT1632(auVar12),local_a80);
  auVar115 = vcmpps_avx(auVar115,auVar142,1);
  auVar119 = vblendvps_avx(ZEXT1632(auVar12),auVar142,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar1),local_a80);
  auVar115 = vcmpps_avx(auVar115,auVar142,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar1),auVar142,auVar115);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar287,auVar288);
  auVar174 = vrcpps_avx(auVar274);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar170._16_4_ = 0x3f800000;
  auVar170._20_4_ = 0x3f800000;
  auVar170._24_4_ = 0x3f800000;
  auVar170._28_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar274,auVar174,auVar170);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar174,auVar174);
  auVar274 = vrcpps_avx(auVar119);
  auVar12 = vfnmadd213ps_fma(auVar119,auVar274,auVar170);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar274,auVar274);
  auVar274 = vrcpps_avx(auVar115);
  auVar1 = vfnmadd213ps_fma(auVar115,auVar274,auVar170);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 7 + 6));
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar274,auVar274);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar5));
  auVar174._4_4_ = auVar11._4_4_ * auVar115._4_4_;
  auVar174._0_4_ = auVar11._0_4_ * auVar115._0_4_;
  auVar174._8_4_ = auVar11._8_4_ * auVar115._8_4_;
  auVar174._12_4_ = auVar11._12_4_ * auVar115._12_4_;
  auVar174._16_4_ = auVar115._16_4_ * 0.0;
  auVar174._20_4_ = auVar115._20_4_ * 0.0;
  auVar174._24_4_ = auVar115._24_4_ * 0.0;
  auVar174._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar5));
  auVar274 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0xe + 6));
  auVar13._4_4_ = auVar11._4_4_ * auVar115._4_4_;
  auVar13._0_4_ = auVar11._0_4_ * auVar115._0_4_;
  auVar13._8_4_ = auVar11._8_4_ * auVar115._8_4_;
  auVar13._12_4_ = auVar11._12_4_ * auVar115._12_4_;
  auVar13._16_4_ = auVar115._16_4_ * 0.0;
  auVar13._20_4_ = auVar115._20_4_ * 0.0;
  auVar13._24_4_ = auVar115._24_4_ * 0.0;
  auVar13._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar274);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar3));
  auVar124._4_4_ = auVar12._4_4_ * auVar115._4_4_;
  auVar124._0_4_ = auVar12._0_4_ * auVar115._0_4_;
  auVar124._8_4_ = auVar12._8_4_ * auVar115._8_4_;
  auVar124._12_4_ = auVar12._12_4_ * auVar115._12_4_;
  auVar124._16_4_ = auVar115._16_4_ * 0.0;
  auVar124._20_4_ = auVar115._20_4_ * 0.0;
  auVar124._24_4_ = auVar115._24_4_ * 0.0;
  auVar124._28_4_ = auVar115._28_4_;
  auVar141._1_3_ = 0;
  auVar141[0] = PVar8;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar3));
  auVar288._4_4_ = auVar12._4_4_ * auVar115._4_4_;
  auVar288._0_4_ = auVar12._0_4_ * auVar115._0_4_;
  auVar288._8_4_ = auVar12._8_4_ * auVar115._8_4_;
  auVar288._12_4_ = auVar12._12_4_ * auVar115._12_4_;
  auVar288._16_4_ = auVar115._16_4_ * 0.0;
  auVar288._20_4_ = auVar115._20_4_ * 0.0;
  auVar288._24_4_ = auVar115._24_4_ * 0.0;
  auVar288._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0x15 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar2));
  auVar274 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0x17 + 6));
  auVar230._4_4_ = auVar115._4_4_ * auVar1._4_4_;
  auVar230._0_4_ = auVar115._0_4_ * auVar1._0_4_;
  auVar230._8_4_ = auVar115._8_4_ * auVar1._8_4_;
  auVar230._12_4_ = auVar115._12_4_ * auVar1._12_4_;
  auVar230._16_4_ = auVar115._16_4_ * 0.0;
  auVar230._20_4_ = auVar115._20_4_ * 0.0;
  auVar230._24_4_ = auVar115._24_4_ * 0.0;
  auVar230._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar274);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar2));
  auVar14._4_4_ = auVar1._4_4_ * auVar115._4_4_;
  auVar14._0_4_ = auVar1._0_4_ * auVar115._0_4_;
  auVar14._8_4_ = auVar1._8_4_ * auVar115._8_4_;
  auVar14._12_4_ = auVar1._12_4_ * auVar115._12_4_;
  auVar14._16_4_ = auVar115._16_4_ * 0.0;
  auVar14._20_4_ = auVar115._20_4_ * 0.0;
  auVar14._24_4_ = auVar115._24_4_ * 0.0;
  auVar14._28_4_ = auVar115._28_4_;
  auVar115 = vpminsd_avx2(auVar174,auVar13);
  auVar274 = vpminsd_avx2(auVar124,auVar288);
  auVar115 = vmaxps_avx(auVar115,auVar274);
  auVar274 = vpminsd_avx2(auVar230,auVar14);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar260._4_4_ = uVar100;
  auVar260._0_4_ = uVar100;
  auVar260._8_4_ = uVar100;
  auVar260._12_4_ = uVar100;
  auVar260._16_4_ = uVar100;
  auVar260._20_4_ = uVar100;
  auVar260._24_4_ = uVar100;
  auVar260._28_4_ = uVar100;
  auVar274 = vmaxps_avx(auVar274,auVar260);
  auVar115 = vmaxps_avx(auVar115,auVar274);
  local_340._4_4_ = auVar115._4_4_ * 0.99999964;
  local_340._0_4_ = auVar115._0_4_ * 0.99999964;
  local_340._8_4_ = auVar115._8_4_ * 0.99999964;
  local_340._12_4_ = auVar115._12_4_ * 0.99999964;
  local_340._16_4_ = auVar115._16_4_ * 0.99999964;
  local_340._20_4_ = auVar115._20_4_ * 0.99999964;
  local_340._24_4_ = auVar115._24_4_ * 0.99999964;
  local_340._28_4_ = 0x3f7ffffa;
  auVar115 = vpmaxsd_avx2(auVar174,auVar13);
  auVar274 = vpmaxsd_avx2(auVar124,auVar288);
  auVar115 = vminps_avx(auVar115,auVar274);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar169._4_4_ = uVar100;
  auVar169._0_4_ = uVar100;
  auVar169._8_4_ = uVar100;
  auVar169._12_4_ = uVar100;
  auVar169._16_4_ = uVar100;
  auVar169._20_4_ = uVar100;
  auVar169._24_4_ = uVar100;
  auVar169._28_4_ = uVar100;
  auVar274 = vpmaxsd_avx2(auVar230,auVar14);
  auVar274 = vminps_avx(auVar274,auVar169);
  auVar115 = vminps_avx(auVar115,auVar274);
  auVar274._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar274._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar274._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar274._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar274._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar274._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar274._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar274._28_4_ = auVar115._28_4_;
  auVar141[4] = PVar8;
  auVar141._5_3_ = 0;
  auVar141[8] = PVar8;
  auVar141._9_3_ = 0;
  auVar141[0xc] = PVar8;
  auVar141._13_3_ = 0;
  auVar141[0x10] = PVar8;
  auVar141._17_3_ = 0;
  auVar141[0x14] = PVar8;
  auVar141._21_3_ = 0;
  auVar141[0x18] = PVar8;
  auVar141._25_3_ = 0;
  auVar141[0x1c] = PVar8;
  auVar141._29_3_ = 0;
  auVar115 = vcmpps_avx(local_340,auVar274,2);
  auVar274 = vpcmpgtd_avx2(auVar141,_DAT_01fb4ba0);
  auVar115 = vandps_avx(auVar115,auVar274);
  uVar100 = vmovmskps_avx(auVar115);
  local_988 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar100);
  auVar115._16_16_ = mm_lookupmask_ps._240_16_;
  auVar115._0_16_ = mm_lookupmask_ps._240_16_;
  local_840 = vblendps_avx(auVar115,ZEXT832(0) << 0x20,0x80);
  iVar91 = 1 << ((uint)k & 0x1f);
  auVar116._4_4_ = iVar91;
  auVar116._0_4_ = iVar91;
  auVar116._8_4_ = iVar91;
  auVar116._12_4_ = iVar91;
  auVar116._16_4_ = iVar91;
  auVar116._20_4_ = iVar91;
  auVar116._24_4_ = iVar91;
  auVar116._28_4_ = iVar91;
  auVar274 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar115 = vpand_avx2(auVar116,auVar274);
  local_780 = vpcmpeqd_avx2(auVar115,auVar274);
  local_998 = prim;
LAB_01345e2d:
  if (local_988 == 0) {
LAB_01348732:
    return local_988 != 0;
  }
  lVar95 = 0;
  for (uVar94 = local_988; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    lVar95 = lVar95 + 1;
  }
  uVar93 = *(uint *)(local_998 + 2);
  local_760 = *(uint *)(local_998 + lVar95 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar93].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_760);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar95 = *(long *)&pGVar9[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar95 + (long)p_Var10 * uVar94);
  auVar12 = *(undefined1 (*) [16])(lVar95 + (uVar94 + 1) * (long)p_Var10);
  local_990 = local_988 - 1 & local_988;
  if (local_990 != 0) {
    uVar99 = local_990 - 1 & local_990;
    for (uVar96 = local_990; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
    }
    if (uVar99 != 0) {
      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar1 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar2 = vinsertps_avx(auVar1,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar242._4_4_ = uVar100;
  auVar242._0_4_ = uVar100;
  auVar242._8_4_ = uVar100;
  auVar242._12_4_ = uVar100;
  fStack_950 = (float)uVar100;
  _local_960 = auVar242;
  fStack_94c = (float)uVar100;
  fStack_948 = (float)uVar100;
  register0x000014dc = uVar100;
  uVar100 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar107._4_4_ = uVar100;
  auVar107._0_4_ = uVar100;
  auVar107._8_4_ = uVar100;
  auVar107._12_4_ = uVar100;
  fStack_870 = (float)uVar100;
  _local_880 = auVar107;
  fStack_86c = (float)uVar100;
  fStack_868 = (float)uVar100;
  register0x0000151c = uVar100;
  auVar277 = ZEXT3264(_local_880);
  auVar1 = vunpcklps_avx(auVar242,auVar107);
  fVar102 = *(float *)(ray + k * 4 + 0xc0);
  auVar279._4_4_ = fVar102;
  auVar279._0_4_ = fVar102;
  auVar279._8_4_ = fVar102;
  auVar279._12_4_ = fVar102;
  fStack_890 = fVar102;
  _local_8a0 = auVar279;
  fStack_88c = fVar102;
  fStack_888 = fVar102;
  register0x0000155c = fVar102;
  local_9f0 = vinsertps_avx(auVar1,auVar279,0x28);
  auVar254 = ZEXT1664(local_9f0);
  auVar160._0_4_ = (auVar11._0_4_ + auVar12._0_4_) * 0.5;
  auVar160._4_4_ = (auVar11._4_4_ + auVar12._4_4_) * 0.5;
  auVar160._8_4_ = (auVar11._8_4_ + auVar12._8_4_) * 0.5;
  auVar160._12_4_ = (auVar11._12_4_ + auVar12._12_4_) * 0.5;
  auVar1 = vsubps_avx(auVar160,auVar2);
  auVar1 = vdpps_avx(auVar1,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar3 = vrcpss_avx(local_a00,local_a00);
  auVar4 = vfnmadd213ss_fma(auVar3,local_a00,ZEXT416(0x40000000));
  fVar132 = auVar1._0_4_ * auVar3._0_4_ * auVar4._0_4_;
  auVar227._4_4_ = fVar132;
  auVar227._0_4_ = fVar132;
  auVar227._8_4_ = fVar132;
  auVar227._12_4_ = fVar132;
  auVar1 = vfmadd231ps_fma(auVar2,local_9f0,auVar227);
  auVar1 = vblendps_avx(auVar1,_DAT_01f45a50,8);
  auVar2 = vsubps_avx(auVar11,auVar1);
  auVar234 = ZEXT1664(auVar2);
  auVar3 = vsubps_avx(*(undefined1 (*) [16])(lVar95 + (uVar94 + 2) * (long)p_Var10),auVar1);
  auVar4 = vsubps_avx(auVar12,auVar1);
  auVar1 = vsubps_avx(*(undefined1 (*) [16])(lVar95 + (uVar94 + 3) * (long)p_Var10),auVar1);
  auVar11 = vmovshdup_avx(auVar2);
  local_1e0 = auVar11._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar11 = vshufps_avx(auVar2,auVar2,0xaa);
  local_5a0 = auVar11._0_8_;
  auVar11 = vshufps_avx(auVar2,auVar2,0xff);
  local_200 = auVar11._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar11 = vmovshdup_avx(auVar4);
  local_220 = auVar11._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar11 = vshufps_avx(auVar4,auVar4,0xaa);
  local_5c0 = auVar11._0_8_;
  auVar11 = vshufps_avx(auVar4,auVar4,0xff);
  local_5e0 = auVar11._0_8_;
  auVar11 = vmovshdup_avx(auVar3);
  local_600 = auVar11._0_8_;
  auVar11 = vshufps_avx(auVar3,auVar3,0xaa);
  local_620 = auVar11._0_8_;
  auVar11 = vshufps_avx(auVar3,auVar3,0xff);
  local_640 = auVar11._0_8_;
  auVar11 = vmovshdup_avx(auVar1);
  local_660 = auVar11._0_8_;
  auVar11 = vshufps_avx(auVar1,auVar1,0xaa);
  uVar103 = auVar11._0_8_;
  local_700._8_8_ = uVar103;
  local_700._0_8_ = uVar103;
  local_700._16_8_ = uVar103;
  local_700._24_8_ = uVar103;
  auVar11 = vshufps_avx(auVar1,auVar1,0xff);
  local_680 = auVar11._0_8_;
  auVar11 = vfmadd231ps_fma(ZEXT432((uint)(fVar102 * fVar102)),_local_880,_local_880);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),_local_960,_local_960);
  uVar100 = auVar11._0_4_;
  local_240._4_4_ = uVar100;
  local_240._0_4_ = uVar100;
  local_240._8_4_ = uVar100;
  local_240._12_4_ = uVar100;
  local_240._16_4_ = uVar100;
  local_240._20_4_ = uVar100;
  local_240._24_4_ = uVar100;
  local_240._28_4_ = uVar100;
  auVar247 = ZEXT3264(local_240);
  fVar102 = *(float *)(ray + k * 4 + 0x60);
  local_9b0 = ZEXT416((uint)fVar132);
  local_320 = fVar102 - fVar132;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  uVar94 = 0;
  bVar98 = 0;
  local_ce4 = 1;
  local_6a0 = auVar2._0_4_;
  local_6c0 = auVar4._0_4_;
  local_6e0 = auVar3._0_4_;
  fVar175 = auVar1._0_4_;
  local_260 = fVar175;
  fStack_25c = fVar175;
  fStack_258 = fVar175;
  fStack_254 = fVar175;
  fStack_250 = fVar175;
  fStack_24c = fVar175;
  fStack_248 = fVar175;
  fStack_244 = fVar175;
  local_720 = vandps_avx(auVar269._0_32_,local_240);
  auVar11 = vsqrtss_avx(local_a00,local_a00);
  auVar12 = vsqrtss_avx(local_a00,local_a00);
  auVar155 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar211 = ZEXT3264(_DAT_01f7b040);
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  uStack_750 = local_760;
  uStack_74c = local_760;
  uStack_748 = local_760;
  uStack_744 = local_760;
  local_740 = uVar93;
  uStack_73c = uVar93;
  uStack_738 = uVar93;
  uStack_734 = uVar93;
  uStack_730 = uVar93;
  uStack_72c = uVar93;
  uStack_728 = uVar93;
  uStack_724 = uVar93;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6cc = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6c4 = local_6e0;
  uStack_6bc = local_6c0;
  uStack_6b8 = local_6c0;
  uStack_6b4 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6ac = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_6a4 = local_6c0;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_690 = local_6a0;
  uStack_68c = local_6a0;
  uStack_688 = local_6a0;
  uStack_684 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  uStack_618 = local_620;
  uStack_610 = local_620;
  uStack_608 = local_620;
  uStack_5f8 = local_600;
  uStack_5f0 = local_600;
  uStack_5e8 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  do {
    auVar188._8_4_ = 0x3f800000;
    auVar188._0_8_ = 0x3f8000003f800000;
    auVar188._12_4_ = 0x3f800000;
    auVar188._16_4_ = 0x3f800000;
    auVar188._20_4_ = 0x3f800000;
    auVar188._24_4_ = 0x3f800000;
    auVar188._28_4_ = 0x3f800000;
    local_790 = auVar155._0_16_;
    auVar5 = vmovshdup_avx(local_790);
    auVar5 = vsubps_avx(auVar5,local_790);
    local_a40._0_4_ = auVar5._0_4_;
    fVar241 = local_a40._0_4_ * 0.04761905;
    uVar100 = auVar155._0_4_;
    auVar216._4_4_ = uVar100;
    auVar216._0_4_ = uVar100;
    auVar216._8_4_ = uVar100;
    auVar216._12_4_ = uVar100;
    auVar216._16_4_ = uVar100;
    auVar216._20_4_ = uVar100;
    auVar216._24_4_ = uVar100;
    auVar216._28_4_ = uVar100;
    local_a40._4_4_ = local_a40._0_4_;
    local_a40._8_4_ = local_a40._0_4_;
    local_a40._12_4_ = local_a40._0_4_;
    local_a40._16_4_ = local_a40._0_4_;
    local_a40._20_4_ = local_a40._0_4_;
    local_a40._24_4_ = local_a40._0_4_;
    local_a40._28_4_ = local_a40._0_4_;
    auVar5 = vfmadd231ps_fma(auVar216,local_a40,auVar211._0_32_);
    auVar115 = vsubps_avx(auVar188,ZEXT1632(auVar5));
    fVar212 = auVar5._0_4_;
    fVar221 = auVar5._4_4_;
    fVar223 = auVar5._8_4_;
    fVar225 = auVar5._12_4_;
    auVar211._28_36_ = auVar247._28_36_;
    auVar211._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * fVar225,
                            CONCAT48(fVar223 * fVar223,CONCAT44(fVar221 * fVar221,fVar212 * fVar212)
                                    )));
    fVar248 = fVar212 * 3.0;
    fVar255 = fVar221 * 3.0;
    fVar256 = fVar223 * 3.0;
    fVar257 = fVar225 * 3.0;
    fVar220 = auVar115._0_4_;
    auVar270._0_4_ = fVar220 * fVar220;
    fVar222 = auVar115._4_4_;
    auVar270._4_4_ = fVar222 * fVar222;
    fVar224 = auVar115._8_4_;
    auVar270._8_4_ = fVar224 * fVar224;
    fVar193 = auVar115._12_4_;
    auVar270._12_4_ = fVar193 * fVar193;
    fVar194 = auVar115._16_4_;
    auVar270._16_4_ = fVar194 * fVar194;
    fVar195 = auVar115._20_4_;
    auVar270._20_4_ = fVar195 * fVar195;
    fVar196 = auVar115._24_4_;
    auVar270._28_36_ = auVar269._28_36_;
    auVar270._24_4_ = fVar196 * fVar196;
    auVar278._0_4_ = (auVar270._0_4_ * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._4_4_ = (auVar270._4_4_ * (fVar222 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._8_4_ = (auVar270._8_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._12_4_ = (auVar270._12_4_ * (fVar193 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._16_4_ = (auVar270._16_4_ * (fVar194 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._20_4_ = (auVar270._20_4_ * (fVar195 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._28_36_ = auVar277._28_36_;
    auVar278._24_4_ = (auVar270._24_4_ * (fVar196 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274 = auVar278._0_32_;
    fVar226 = fVar212 * fVar212 * -fVar220 * 0.5;
    fVar235 = fVar221 * fVar221 * -fVar222 * 0.5;
    fVar236 = fVar223 * fVar223 * -fVar224 * 0.5;
    fVar237 = fVar225 * fVar225 * -fVar193 * 0.5;
    fVar238 = -fVar194 * 0.0 * 0.0 * 0.5;
    fVar239 = -fVar195 * 0.0 * 0.0 * 0.5;
    fVar240 = -fVar196 * 0.0 * 0.0 * 0.5;
    auVar15._4_4_ = fStack_25c * fVar235;
    auVar15._0_4_ = local_260 * fVar226;
    auVar15._8_4_ = fStack_258 * fVar236;
    auVar15._12_4_ = fStack_254 * fVar237;
    auVar15._16_4_ = fStack_250 * fVar238;
    auVar15._20_4_ = fStack_24c * fVar239;
    auVar15._24_4_ = fStack_248 * fVar240;
    auVar15._28_4_ = 0x40000000;
    auVar16._4_4_ = fVar235 * local_660._4_4_;
    auVar16._0_4_ = fVar226 * (float)local_660;
    auVar16._8_4_ = fVar236 * (float)uStack_658;
    auVar16._12_4_ = fVar237 * uStack_658._4_4_;
    auVar16._16_4_ = fVar238 * (float)uStack_650;
    auVar16._20_4_ = fVar239 * uStack_650._4_4_;
    auVar16._24_4_ = fVar240 * (float)uStack_648;
    auVar16._28_4_ = auVar115._28_4_ ^ 0x80000000;
    auVar17._4_4_ = local_700._4_4_ * fVar235;
    auVar17._0_4_ = local_700._0_4_ * fVar226;
    auVar17._8_4_ = local_700._8_4_ * fVar236;
    auVar17._12_4_ = local_700._12_4_ * fVar237;
    auVar17._16_4_ = local_700._16_4_ * fVar238;
    auVar17._20_4_ = local_700._20_4_ * fVar239;
    auVar17._24_4_ = local_700._24_4_ * fVar240;
    auVar17._28_4_ = local_700._28_4_;
    auVar18._4_4_ = fVar235 * local_680._4_4_;
    auVar18._0_4_ = fVar226 * (float)local_680;
    auVar18._8_4_ = fVar236 * (float)uStack_678;
    auVar18._12_4_ = fVar237 * uStack_678._4_4_;
    auVar18._16_4_ = fVar238 * (float)uStack_670;
    auVar18._20_4_ = fVar239 * uStack_670._4_4_;
    auVar18._24_4_ = fVar240 * (float)uStack_668;
    auVar18._28_4_ = auVar234._28_4_;
    auVar66._4_4_ = uStack_6dc;
    auVar66._0_4_ = local_6e0;
    auVar66._8_4_ = uStack_6d8;
    auVar66._12_4_ = uStack_6d4;
    auVar66._16_4_ = uStack_6d0;
    auVar66._20_4_ = uStack_6cc;
    auVar66._24_4_ = uStack_6c8;
    auVar66._28_4_ = uStack_6c4;
    auVar5 = vfmadd231ps_fma(auVar15,auVar274,auVar66);
    auVar76._8_8_ = uStack_5f8;
    auVar76._0_8_ = local_600;
    auVar76._16_8_ = uStack_5f0;
    auVar76._24_8_ = uStack_5e8;
    auVar6 = vfmadd231ps_fma(auVar16,auVar274,auVar76);
    auVar74._8_8_ = uStack_618;
    auVar74._0_8_ = local_620;
    auVar74._16_8_ = uStack_610;
    auVar74._24_8_ = uStack_608;
    auVar7 = vfmadd231ps_fma(auVar17,auVar274,auVar74);
    auVar72._8_8_ = uStack_638;
    auVar72._0_8_ = local_640;
    auVar72._16_8_ = uStack_630;
    auVar72._24_8_ = uStack_628;
    auVar104 = vfmadd231ps_fma(auVar18,auVar274,auVar72);
    auVar19._4_4_ = ((fVar255 + -5.0) * fVar221 * fVar221 + 2.0) * 0.5;
    auVar19._0_4_ = ((fVar248 + -5.0) * fVar212 * fVar212 + 2.0) * 0.5;
    auVar19._8_4_ = ((fVar256 + -5.0) * fVar223 * fVar223 + 2.0) * 0.5;
    auVar19._12_4_ = ((fVar257 + -5.0) * fVar225 * fVar225 + 2.0) * 0.5;
    auVar19._16_4_ = 0x3f800000;
    auVar19._20_4_ = 0x3f800000;
    auVar19._24_4_ = 0x3f800000;
    auVar19._28_4_ = auVar277._28_4_ + 2.0;
    auVar68._4_4_ = uStack_6bc;
    auVar68._0_4_ = local_6c0;
    auVar68._8_4_ = uStack_6b8;
    auVar68._12_4_ = uStack_6b4;
    auVar68._16_4_ = uStack_6b0;
    auVar68._20_4_ = uStack_6ac;
    auVar68._24_4_ = uStack_6a8;
    auVar68._28_4_ = uStack_6a4;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar19,auVar68);
    auVar87._8_8_ = uStack_218;
    auVar87._0_8_ = local_220;
    auVar87._16_8_ = uStack_210;
    auVar87._24_8_ = uStack_208;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar19,auVar87);
    auVar80._8_8_ = uStack_5b8;
    auVar80._0_8_ = local_5c0;
    auVar80._16_8_ = uStack_5b0;
    auVar80._24_8_ = uStack_5a8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar19,auVar80);
    auVar78._8_8_ = uStack_5d8;
    auVar78._0_8_ = local_5e0;
    auVar78._16_8_ = uStack_5d0;
    auVar78._24_8_ = uStack_5c8;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar19,auVar78);
    auVar20._4_4_ = -fVar221 * fVar222 * fVar222 * 0.5;
    auVar20._0_4_ = -fVar212 * fVar220 * fVar220 * 0.5;
    auVar20._8_4_ = -fVar223 * fVar224 * fVar224 * 0.5;
    auVar20._12_4_ = -fVar225 * fVar193 * fVar193 * 0.5;
    auVar20._16_4_ = fVar194 * -0.0 * fVar194 * 0.5;
    auVar20._20_4_ = fVar195 * -0.0 * fVar195 * 0.5;
    auVar20._24_4_ = fVar196 * -0.0 * fVar196 * 0.5;
    auVar20._28_4_ = 0x80000000;
    auVar70._4_4_ = uStack_69c;
    auVar70._0_4_ = local_6a0;
    auVar70._8_4_ = uStack_698;
    auVar70._12_4_ = uStack_694;
    auVar70._16_4_ = uStack_690;
    auVar70._20_4_ = uStack_68c;
    auVar70._24_4_ = uStack_688;
    auVar70._28_4_ = uStack_684;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar20,auVar70);
    auVar89._8_8_ = uStack_1d8;
    auVar89._0_8_ = local_1e0;
    auVar89._16_8_ = uStack_1d0;
    auVar89._24_8_ = uStack_1c8;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar20,auVar89);
    auVar82._8_8_ = uStack_598;
    auVar82._0_8_ = local_5a0;
    auVar82._16_8_ = uStack_590;
    auVar82._24_8_ = uStack_588;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar20,auVar82);
    auVar88._8_8_ = uStack_1f8;
    auVar88._0_8_ = local_200;
    auVar88._16_8_ = uStack_1f0;
    auVar88._24_8_ = uStack_1e8;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar88,auVar20);
    auVar217._0_4_ = (fVar220 + fVar220) * fVar212;
    auVar217._4_4_ = (fVar222 + fVar222) * fVar221;
    auVar217._8_4_ = (fVar224 + fVar224) * fVar223;
    auVar217._12_4_ = (fVar193 + fVar193) * fVar225;
    auVar217._16_4_ = (fVar194 + fVar194) * 0.0;
    auVar217._20_4_ = (fVar195 + fVar195) * 0.0;
    auVar217._24_4_ = (fVar196 + fVar196) * 0.0;
    auVar217._28_4_ = 0;
    auVar274 = vsubps_avx(auVar217,auVar270._0_32_);
    fVar226 = auVar254._28_4_ + 2.0;
    auVar21._4_4_ = (fVar222 + fVar222) * (fVar255 + 2.0);
    auVar21._0_4_ = (fVar220 + fVar220) * (fVar248 + 2.0);
    auVar21._8_4_ = (fVar224 + fVar224) * (fVar256 + 2.0);
    auVar21._12_4_ = (fVar193 + fVar193) * (fVar257 + 2.0);
    auVar21._16_4_ = (fVar194 + fVar194) * 2.0;
    auVar21._20_4_ = (fVar195 + fVar195) * 2.0;
    auVar21._24_4_ = (fVar196 + fVar196) * 2.0;
    auVar21._28_4_ = fVar226;
    auVar22._4_4_ = fVar222 * fVar222 * 3.0;
    auVar22._0_4_ = fVar220 * fVar220 * 3.0;
    auVar22._8_4_ = fVar224 * fVar224 * 3.0;
    auVar22._12_4_ = fVar193 * fVar193 * 3.0;
    auVar22._16_4_ = fVar194 * fVar194 * 3.0;
    auVar22._20_4_ = fVar195 * fVar195 * 3.0;
    auVar22._24_4_ = fVar196 * fVar196 * 3.0;
    auVar22._28_4_ = auVar115._28_4_;
    auVar115 = vsubps_avx(auVar21,auVar22);
    auVar119 = vsubps_avx(auVar211._0_32_,auVar217);
    auVar23._4_4_ = auVar274._4_4_ * 0.5;
    auVar23._0_4_ = auVar274._0_4_ * 0.5;
    auVar23._8_4_ = auVar274._8_4_ * 0.5;
    auVar23._12_4_ = auVar274._12_4_ * 0.5;
    auVar23._16_4_ = auVar274._16_4_ * 0.5;
    auVar23._20_4_ = auVar274._20_4_ * 0.5;
    auVar23._24_4_ = auVar274._24_4_ * 0.5;
    auVar23._28_4_ = auVar247._28_4_;
    auVar24._28_4_ = fVar226;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412((fVar257 * fVar225 + (fVar225 + fVar225) * (fVar257 + -5.0)) * 0.5,
                            CONCAT48((fVar256 * fVar223 + (fVar223 + fVar223) * (fVar256 + -5.0)) *
                                     0.5,CONCAT44((fVar255 * fVar221 +
                                                  (fVar221 + fVar221) * (fVar255 + -5.0)) * 0.5,
                                                  (fVar248 * fVar212 +
                                                  (fVar212 + fVar212) * (fVar248 + -5.0)) * 0.5))));
    auVar25._4_4_ = auVar115._4_4_ * 0.5;
    auVar25._0_4_ = auVar115._0_4_ * 0.5;
    auVar25._8_4_ = auVar115._8_4_ * 0.5;
    auVar25._12_4_ = auVar115._12_4_ * 0.5;
    auVar25._16_4_ = auVar115._16_4_ * 0.5;
    auVar25._20_4_ = auVar115._20_4_ * 0.5;
    auVar25._24_4_ = auVar115._24_4_ * 0.5;
    auVar25._28_4_ = auVar115._28_4_;
    fVar212 = auVar119._0_4_ * 0.5;
    fVar220 = auVar119._4_4_ * 0.5;
    fVar221 = auVar119._8_4_ * 0.5;
    fVar222 = auVar119._12_4_ * 0.5;
    fVar223 = auVar119._16_4_ * 0.5;
    fVar224 = auVar119._20_4_ * 0.5;
    fVar225 = auVar119._24_4_ * 0.5;
    auVar26._4_4_ = fStack_25c * fVar220;
    auVar26._0_4_ = local_260 * fVar212;
    auVar26._8_4_ = fStack_258 * fVar221;
    auVar26._12_4_ = fStack_254 * fVar222;
    auVar26._16_4_ = fStack_250 * fVar223;
    auVar26._20_4_ = fStack_24c * fVar224;
    auVar26._24_4_ = fStack_248 * fVar225;
    auVar26._28_4_ = fStack_244;
    auVar27._4_4_ = fVar220 * local_660._4_4_;
    auVar27._0_4_ = fVar212 * (float)local_660;
    auVar27._8_4_ = fVar221 * (float)uStack_658;
    auVar27._12_4_ = fVar222 * uStack_658._4_4_;
    auVar27._16_4_ = fVar223 * (float)uStack_650;
    auVar27._20_4_ = fVar224 * uStack_650._4_4_;
    auVar27._24_4_ = fVar225 * (float)uStack_648;
    auVar27._28_4_ = auVar274._28_4_;
    auVar28._4_4_ = fVar220 * local_700._4_4_;
    auVar28._0_4_ = fVar212 * local_700._0_4_;
    auVar28._8_4_ = fVar221 * local_700._8_4_;
    auVar28._12_4_ = fVar222 * local_700._12_4_;
    auVar28._16_4_ = fVar223 * local_700._16_4_;
    auVar28._20_4_ = fVar224 * local_700._20_4_;
    auVar28._24_4_ = fVar225 * local_700._24_4_;
    auVar28._28_4_ = auVar254._28_4_ + -5.0 + 0.0;
    auVar29._4_4_ = fVar220 * local_680._4_4_;
    auVar29._0_4_ = fVar212 * (float)local_680;
    auVar29._8_4_ = fVar221 * (float)uStack_678;
    auVar29._12_4_ = fVar222 * uStack_678._4_4_;
    auVar29._16_4_ = fVar223 * (float)uStack_670;
    auVar29._20_4_ = fVar224 * uStack_670._4_4_;
    auVar29._24_4_ = fVar225 * (float)uStack_668;
    auVar29._28_4_ = auVar119._28_4_;
    auVar67._4_4_ = uStack_6dc;
    auVar67._0_4_ = local_6e0;
    auVar67._8_4_ = uStack_6d8;
    auVar67._12_4_ = uStack_6d4;
    auVar67._16_4_ = uStack_6d0;
    auVar67._20_4_ = uStack_6cc;
    auVar67._24_4_ = uStack_6c8;
    auVar67._28_4_ = uStack_6c4;
    auVar213 = vfmadd231ps_fma(auVar26,auVar25,auVar67);
    auVar77._8_8_ = uStack_5f8;
    auVar77._0_8_ = local_600;
    auVar77._16_8_ = uStack_5f0;
    auVar77._24_8_ = uStack_5e8;
    auVar160 = vfmadd231ps_fma(auVar27,auVar25,auVar77);
    auVar75._8_8_ = uStack_618;
    auVar75._0_8_ = local_620;
    auVar75._16_8_ = uStack_610;
    auVar75._24_8_ = uStack_608;
    auVar242 = vfmadd231ps_fma(auVar28,auVar25,auVar75);
    auVar73._8_8_ = uStack_638;
    auVar73._0_8_ = local_640;
    auVar73._16_8_ = uStack_630;
    auVar73._24_8_ = uStack_628;
    auVar107 = vfmadd231ps_fma(auVar29,auVar25,auVar73);
    auVar69._4_4_ = uStack_6bc;
    auVar69._0_4_ = local_6c0;
    auVar69._8_4_ = uStack_6b8;
    auVar69._12_4_ = uStack_6b4;
    auVar69._16_4_ = uStack_6b0;
    auVar69._20_4_ = uStack_6ac;
    auVar69._24_4_ = uStack_6a8;
    auVar69._28_4_ = uStack_6a4;
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar24,auVar69);
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar24,auVar87);
    auVar81._8_8_ = uStack_5b8;
    auVar81._0_8_ = local_5c0;
    auVar81._16_8_ = uStack_5b0;
    auVar81._24_8_ = uStack_5a8;
    auVar242 = vfmadd231ps_fma(ZEXT1632(auVar242),auVar24,auVar81);
    auVar79._8_8_ = uStack_5d8;
    auVar79._0_8_ = local_5e0;
    auVar79._16_8_ = uStack_5d0;
    auVar79._24_8_ = uStack_5c8;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar24,auVar79);
    auVar71._4_4_ = uStack_69c;
    auVar71._0_4_ = local_6a0;
    auVar71._8_4_ = uStack_698;
    auVar71._12_4_ = uStack_694;
    auVar71._16_4_ = uStack_690;
    auVar71._20_4_ = uStack_68c;
    auVar71._24_4_ = uStack_688;
    auVar71._28_4_ = uStack_684;
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar23,auVar71);
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar23,auVar89);
    auVar83._8_8_ = uStack_598;
    auVar83._0_8_ = local_5a0;
    auVar83._16_8_ = uStack_590;
    auVar83._24_8_ = uStack_588;
    auVar242 = vfmadd231ps_fma(ZEXT1632(auVar242),auVar23,auVar83);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar88,auVar23);
    local_8c0._0_4_ = auVar213._0_4_ * fVar241;
    local_8c0._4_4_ = auVar213._4_4_ * fVar241;
    local_8c0._8_4_ = auVar213._8_4_ * fVar241;
    local_8c0._12_4_ = auVar213._12_4_ * fVar241;
    local_8c0._16_4_ = fVar241 * 0.0;
    local_8c0._20_4_ = fVar241 * 0.0;
    local_8c0._24_4_ = fVar241 * 0.0;
    local_8c0._28_4_ = 0;
    auVar266._0_4_ = auVar160._0_4_ * fVar241;
    auVar266._4_4_ = auVar160._4_4_ * fVar241;
    auVar266._8_4_ = auVar160._8_4_ * fVar241;
    auVar266._12_4_ = auVar160._12_4_ * fVar241;
    auVar266._16_4_ = fVar241 * 0.0;
    auVar266._20_4_ = fVar241 * 0.0;
    auVar266._24_4_ = fVar241 * 0.0;
    auVar266._28_4_ = 0;
    auVar271._0_4_ = auVar242._0_4_ * fVar241;
    auVar271._4_4_ = auVar242._4_4_ * fVar241;
    auVar271._8_4_ = auVar242._8_4_ * fVar241;
    auVar271._12_4_ = auVar242._12_4_ * fVar241;
    auVar271._16_4_ = fVar241 * 0.0;
    auVar271._20_4_ = fVar241 * 0.0;
    auVar271._24_4_ = fVar241 * 0.0;
    auVar271._28_4_ = 0;
    fVar212 = fVar241 * auVar107._0_4_;
    fVar220 = fVar241 * auVar107._4_4_;
    auVar30._4_4_ = fVar220;
    auVar30._0_4_ = fVar212;
    fVar221 = fVar241 * auVar107._8_4_;
    auVar30._8_4_ = fVar221;
    fVar222 = fVar241 * auVar107._12_4_;
    auVar30._12_4_ = fVar222;
    auVar30._16_4_ = fVar241 * 0.0;
    auVar30._20_4_ = fVar241 * 0.0;
    auVar30._24_4_ = fVar241 * 0.0;
    auVar30._28_4_ = fVar241;
    auVar260 = ZEXT1632(auVar5);
    auVar245 = vpermps_avx2(_DAT_01fb7720,auVar260);
    _local_a20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar7));
    local_2a0 = vsubps_avx(auVar245,ZEXT1632(auVar5));
    local_280 = vsubps_avx(_local_a20,ZEXT1632(auVar7));
    fVar193 = local_280._0_4_;
    fVar194 = local_280._4_4_;
    auVar31._4_4_ = fVar194 * local_8c0._4_4_;
    auVar31._0_4_ = fVar193 * local_8c0._0_4_;
    fVar195 = local_280._8_4_;
    auVar31._8_4_ = fVar195 * local_8c0._8_4_;
    fVar196 = local_280._12_4_;
    auVar31._12_4_ = fVar196 * local_8c0._12_4_;
    fVar238 = local_280._16_4_;
    auVar31._16_4_ = fVar238 * local_8c0._16_4_;
    fVar239 = local_280._20_4_;
    auVar31._20_4_ = fVar239 * local_8c0._20_4_;
    fVar240 = local_280._24_4_;
    auVar31._24_4_ = fVar240 * local_8c0._24_4_;
    auVar31._28_4_ = auVar245._28_4_;
    auVar5 = vfmsub231ps_fma(auVar31,auVar271,local_2a0);
    auVar116 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar6));
    local_2c0 = vsubps_avx(auVar116,ZEXT1632(auVar6));
    fVar248 = local_2a0._0_4_;
    fVar255 = local_2a0._4_4_;
    auVar32._4_4_ = fVar255 * auVar266._4_4_;
    auVar32._0_4_ = fVar248 * auVar266._0_4_;
    fVar256 = local_2a0._8_4_;
    auVar32._8_4_ = fVar256 * auVar266._8_4_;
    fVar257 = local_2a0._12_4_;
    auVar32._12_4_ = fVar257 * auVar266._12_4_;
    fVar283 = local_2a0._16_4_;
    auVar32._16_4_ = fVar283 * auVar266._16_4_;
    fVar284 = local_2a0._20_4_;
    auVar32._20_4_ = fVar284 * auVar266._20_4_;
    fVar285 = local_2a0._24_4_;
    auVar32._24_4_ = fVar285 * auVar266._24_4_;
    auVar32._28_4_ = auVar116._28_4_;
    auVar213 = vfmsub231ps_fma(auVar32,local_8c0,local_2c0);
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar213._12_4_ * auVar213._12_4_,
                                                CONCAT48(auVar213._8_4_ * auVar213._8_4_,
                                                         CONCAT44(auVar213._4_4_ * auVar213._4_4_,
                                                                  auVar213._0_4_ * auVar213._0_4_)))
                                     ),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar203._0_4_ = fVar193 * fVar193;
    auVar203._4_4_ = fVar194 * fVar194;
    auVar203._8_4_ = fVar195 * fVar195;
    auVar203._12_4_ = fVar196 * fVar196;
    auVar203._16_4_ = fVar238 * fVar238;
    auVar203._20_4_ = fVar239 * fVar239;
    auVar203._24_4_ = fVar240 * fVar240;
    auVar203._28_4_ = 0;
    auVar213 = vfmadd231ps_fma(auVar203,local_2c0,local_2c0);
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),local_2a0,local_2a0);
    fVar226 = local_2c0._0_4_;
    fVar235 = local_2c0._4_4_;
    auVar33._4_4_ = fVar235 * auVar271._4_4_;
    auVar33._0_4_ = fVar226 * auVar271._0_4_;
    fVar236 = local_2c0._8_4_;
    auVar33._8_4_ = fVar236 * auVar271._8_4_;
    fVar237 = local_2c0._12_4_;
    auVar33._12_4_ = fVar237 * auVar271._12_4_;
    fVar290 = local_2c0._16_4_;
    auVar33._16_4_ = fVar290 * auVar271._16_4_;
    fVar291 = local_2c0._20_4_;
    auVar33._20_4_ = fVar291 * auVar271._20_4_;
    fVar292 = local_2c0._24_4_;
    auVar33._24_4_ = fVar292 * auVar271._24_4_;
    auVar33._28_4_ = auVar247._28_4_;
    auVar115 = vrcpps_avx(ZEXT1632(auVar213));
    auVar160 = vfmsub231ps_fma(auVar33,auVar266,local_280);
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar160),ZEXT1632(auVar160));
    auVar117._8_4_ = 0x3f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    auVar117._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar213),auVar117);
    auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar115,auVar115);
    local_8e0 = vpermps_avx2(_DAT_01fb7720,local_8c0);
    local_900 = vpermps_avx2(_DAT_01fb7720,auVar271);
    auVar34._4_4_ = fVar194 * local_8e0._4_4_;
    auVar34._0_4_ = fVar193 * local_8e0._0_4_;
    auVar34._8_4_ = fVar195 * local_8e0._8_4_;
    auVar34._12_4_ = fVar196 * local_8e0._12_4_;
    auVar34._16_4_ = fVar238 * local_8e0._16_4_;
    auVar34._20_4_ = fVar239 * local_8e0._20_4_;
    auVar34._24_4_ = fVar240 * local_8e0._24_4_;
    auVar34._28_4_ = auVar115._28_4_;
    auVar242 = vfmsub231ps_fma(auVar34,local_900,local_2a0);
    auVar141 = vpermps_avx2(_DAT_01fb7720,auVar266);
    auVar35._4_4_ = fVar255 * auVar141._4_4_;
    auVar35._0_4_ = fVar248 * auVar141._0_4_;
    auVar35._8_4_ = fVar256 * auVar141._8_4_;
    auVar35._12_4_ = fVar257 * auVar141._12_4_;
    auVar35._16_4_ = fVar283 * auVar141._16_4_;
    auVar35._20_4_ = fVar284 * auVar141._20_4_;
    auVar35._24_4_ = fVar285 * auVar141._24_4_;
    auVar35._28_4_ = 0;
    auVar107 = vfmsub231ps_fma(auVar35,local_8e0,local_2c0);
    auVar242 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * auVar107._12_4_,
                                                  CONCAT48(auVar107._8_4_ * auVar107._8_4_,
                                                           CONCAT44(auVar107._4_4_ * auVar107._4_4_,
                                                                    auVar107._0_4_ * auVar107._0_4_)
                                                          ))),ZEXT1632(auVar242),ZEXT1632(auVar242))
    ;
    auVar252._0_4_ = fVar226 * local_900._0_4_;
    auVar252._4_4_ = fVar235 * local_900._4_4_;
    auVar252._8_4_ = fVar236 * local_900._8_4_;
    auVar252._12_4_ = fVar237 * local_900._12_4_;
    auVar252._16_4_ = fVar290 * local_900._16_4_;
    auVar252._20_4_ = fVar291 * local_900._20_4_;
    auVar252._24_4_ = fVar292 * local_900._24_4_;
    auVar252._28_4_ = 0;
    auVar107 = vfmsub231ps_fma(auVar252,auVar141,local_280);
    auVar242 = vfmadd231ps_fma(ZEXT1632(auVar242),ZEXT1632(auVar107),ZEXT1632(auVar107));
    auVar115 = vmaxps_avx(ZEXT1632(CONCAT412(auVar160._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar160._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar160._4_4_ * auVar5._4_4_,
                                                               auVar160._0_4_ * auVar5._0_4_)))),
                          ZEXT1632(CONCAT412(auVar242._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar242._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar242._4_4_ * auVar5._4_4_,
                                                               auVar242._0_4_ * auVar5._0_4_)))));
    local_920._0_4_ = auVar104._0_4_ + fVar212;
    local_920._4_4_ = auVar104._4_4_ + fVar220;
    local_920._8_4_ = auVar104._8_4_ + fVar221;
    local_920._12_4_ = auVar104._12_4_ + fVar222;
    local_920._16_4_ = fVar241 * 0.0 + 0.0;
    local_920._20_4_ = fVar241 * 0.0 + 0.0;
    local_920._24_4_ = fVar241 * 0.0 + 0.0;
    local_920._28_4_ = fVar241 + 0.0;
    local_a60 = ZEXT1632(auVar104);
    auVar274 = vsubps_avx(local_a60,auVar30);
    local_940 = vpermps_avx2(_DAT_01fb7720,auVar274);
    auVar169 = vpermps_avx2(_DAT_01fb7720,local_a60);
    auVar274 = vmaxps_avx(local_a60,local_920);
    auVar174 = vrsqrtps_avx(ZEXT1632(auVar213));
    auVar119 = vmaxps_avx(local_940,auVar169);
    auVar274 = vmaxps_avx(auVar274,auVar119);
    fVar212 = auVar174._0_4_;
    fVar220 = auVar174._4_4_;
    fVar221 = auVar174._8_4_;
    fVar222 = auVar174._12_4_;
    fVar223 = auVar174._16_4_;
    fVar224 = auVar174._20_4_;
    fVar225 = auVar174._24_4_;
    auVar228._0_4_ = fVar212 * fVar212 * fVar212 * auVar213._0_4_ * -0.5;
    auVar228._4_4_ = fVar220 * fVar220 * fVar220 * auVar213._4_4_ * -0.5;
    auVar228._8_4_ = fVar221 * fVar221 * fVar221 * auVar213._8_4_ * -0.5;
    auVar228._12_4_ = fVar222 * fVar222 * fVar222 * auVar213._12_4_ * -0.5;
    auVar228._16_4_ = fVar223 * fVar223 * fVar223 * -0.0;
    auVar228._20_4_ = fVar224 * fVar224 * fVar224 * -0.0;
    auVar228._24_4_ = fVar225 * fVar225 * fVar225 * -0.0;
    auVar228._28_4_ = 0;
    auVar118._8_4_ = 0x3fc00000;
    auVar118._0_8_ = 0x3fc000003fc00000;
    auVar118._12_4_ = 0x3fc00000;
    auVar118._16_4_ = 0x3fc00000;
    auVar118._20_4_ = 0x3fc00000;
    auVar118._24_4_ = 0x3fc00000;
    auVar118._28_4_ = 0x3fc00000;
    auVar5 = vfmadd231ps_fma(auVar228,auVar118,auVar174);
    fVar212 = auVar5._0_4_;
    fVar221 = auVar5._4_4_;
    auVar36._4_4_ = fVar235 * fVar221;
    auVar36._0_4_ = fVar226 * fVar212;
    fVar223 = auVar5._8_4_;
    auVar36._8_4_ = fVar236 * fVar223;
    fVar225 = auVar5._12_4_;
    auVar36._12_4_ = fVar237 * fVar225;
    auVar36._16_4_ = fVar290 * 0.0;
    auVar36._20_4_ = fVar291 * 0.0;
    auVar36._24_4_ = fVar292 * 0.0;
    auVar36._28_4_ = 0;
    auVar37._4_4_ = (float)local_8a0._4_4_ * fVar194 * fVar221;
    auVar37._0_4_ = (float)local_8a0._0_4_ * fVar193 * fVar212;
    auVar37._8_4_ = fStack_898 * fVar195 * fVar223;
    auVar37._12_4_ = fStack_894 * fVar196 * fVar225;
    auVar37._16_4_ = fStack_890 * fVar238 * 0.0;
    auVar37._20_4_ = fStack_88c * fVar239 * 0.0;
    auVar37._24_4_ = fStack_888 * fVar240 * 0.0;
    auVar37._28_4_ = local_280._28_4_;
    auVar104 = vfmadd231ps_fma(auVar37,auVar36,_local_880);
    auVar170 = ZEXT1632(auVar7);
    auVar119 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar174 = vsubps_avx(auVar119,auVar170);
    auVar254 = ZEXT3264(auVar174);
    fVar241 = auVar174._0_4_;
    fVar226 = auVar174._4_4_;
    auVar38._4_4_ = fVar226 * fVar194 * fVar221;
    auVar38._0_4_ = fVar241 * fVar193 * fVar212;
    fVar235 = auVar174._8_4_;
    auVar38._8_4_ = fVar235 * fVar195 * fVar223;
    fVar236 = auVar174._12_4_;
    auVar38._12_4_ = fVar236 * fVar196 * fVar225;
    fVar237 = auVar174._16_4_;
    auVar38._16_4_ = fVar237 * fVar238 * 0.0;
    fVar238 = auVar174._20_4_;
    auVar38._20_4_ = fVar238 * fVar239 * 0.0;
    fVar239 = auVar174._24_4_;
    auVar38._24_4_ = fVar239 * fVar240 * 0.0;
    auVar38._28_4_ = local_2c0._28_4_;
    auVar142 = ZEXT1632(auVar6);
    auVar13 = vsubps_avx(auVar119,auVar142);
    auVar247 = ZEXT3264(auVar13);
    auVar6 = vfmadd231ps_fma(auVar38,auVar13,auVar36);
    auVar39._4_4_ = fVar255 * fVar221;
    auVar39._0_4_ = fVar248 * fVar212;
    auVar39._8_4_ = fVar256 * fVar223;
    auVar39._12_4_ = fVar257 * fVar225;
    auVar39._16_4_ = fVar283 * 0.0;
    auVar39._20_4_ = fVar284 * 0.0;
    auVar39._24_4_ = fVar285 * 0.0;
    auVar39._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar39,_local_960);
    auVar277 = ZEXT1664(auVar7);
    auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar124 = vsubps_avx(auVar120,auVar260);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar124,auVar39);
    auVar40._4_4_ = (float)local_8a0._4_4_ * fVar226;
    auVar40._0_4_ = (float)local_8a0._0_4_ * fVar241;
    auVar40._8_4_ = fStack_898 * fVar235;
    auVar40._12_4_ = fStack_894 * fVar236;
    auVar40._16_4_ = fStack_890 * fVar237;
    auVar40._20_4_ = fStack_88c * fVar238;
    auVar40._24_4_ = fStack_888 * fVar239;
    auVar40._28_4_ = 0;
    auVar104 = vfmadd231ps_fma(auVar40,_local_880,auVar13);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_960,auVar124);
    fVar220 = auVar6._0_4_;
    fVar240 = auVar7._0_4_;
    fVar222 = auVar6._4_4_;
    fVar248 = auVar7._4_4_;
    fVar224 = auVar6._8_4_;
    fVar255 = auVar7._8_4_;
    fVar193 = auVar6._12_4_;
    fVar256 = auVar7._12_4_;
    uVar100 = local_880._28_4_;
    auVar41._28_4_ = uVar100;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar256 * fVar193,
                            CONCAT48(fVar255 * fVar224,CONCAT44(fVar248 * fVar222,fVar240 * fVar220)
                                    )));
    auVar288 = vsubps_avx(ZEXT1632(auVar104),auVar41);
    auVar42._4_4_ = fVar226 * fVar226;
    auVar42._0_4_ = fVar241 * fVar241;
    auVar42._8_4_ = fVar235 * fVar235;
    auVar42._12_4_ = fVar236 * fVar236;
    auVar42._16_4_ = fVar237 * fVar237;
    auVar42._20_4_ = fVar238 * fVar238;
    auVar42._24_4_ = fVar239 * fVar239;
    auVar42._28_4_ = uVar100;
    auVar104 = vfmadd231ps_fma(auVar42,auVar13,auVar13);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar124,auVar124);
    auVar43._28_4_ = local_2a0._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar193 * fVar193,
                            CONCAT48(fVar224 * fVar224,CONCAT44(fVar222 * fVar222,fVar220 * fVar220)
                                    )));
    auVar230 = vsubps_avx(ZEXT1632(auVar104),auVar43);
    auVar119 = vsqrtps_avx(auVar115);
    fVar220 = (auVar119._0_4_ + auVar274._0_4_) * 1.0000002;
    fVar222 = (auVar119._4_4_ + auVar274._4_4_) * 1.0000002;
    fVar224 = (auVar119._8_4_ + auVar274._8_4_) * 1.0000002;
    fVar193 = (auVar119._12_4_ + auVar274._12_4_) * 1.0000002;
    fVar194 = (auVar119._16_4_ + auVar274._16_4_) * 1.0000002;
    fVar195 = (auVar119._20_4_ + auVar274._20_4_) * 1.0000002;
    fVar196 = (auVar119._24_4_ + auVar274._24_4_) * 1.0000002;
    auVar44._4_4_ = fVar222 * fVar222;
    auVar44._0_4_ = fVar220 * fVar220;
    auVar44._8_4_ = fVar224 * fVar224;
    auVar44._12_4_ = fVar193 * fVar193;
    auVar44._16_4_ = fVar194 * fVar194;
    auVar44._20_4_ = fVar195 * fVar195;
    auVar44._24_4_ = fVar196 * fVar196;
    auVar44._28_4_ = auVar119._28_4_ + auVar274._28_4_;
    auVar295._0_4_ = auVar288._0_4_ + auVar288._0_4_;
    auVar295._4_4_ = auVar288._4_4_ + auVar288._4_4_;
    auVar295._8_4_ = auVar288._8_4_ + auVar288._8_4_;
    auVar295._12_4_ = auVar288._12_4_ + auVar288._12_4_;
    auVar295._16_4_ = auVar288._16_4_ + auVar288._16_4_;
    auVar295._20_4_ = auVar288._20_4_ + auVar288._20_4_;
    auVar295._24_4_ = auVar288._24_4_ + auVar288._24_4_;
    auVar295._28_4_ = auVar288._28_4_ + auVar288._28_4_;
    auVar274 = vsubps_avx(auVar230,auVar44);
    auVar251 = ZEXT1632(auVar7);
    auVar45._28_4_ = 0x3f800002;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar256 * fVar256,
                            CONCAT48(fVar255 * fVar255,CONCAT44(fVar248 * fVar248,fVar240 * fVar240)
                                    )));
    auVar288 = vsubps_avx(local_240,auVar45);
    auVar46._4_4_ = auVar295._4_4_ * auVar295._4_4_;
    auVar46._0_4_ = auVar295._0_4_ * auVar295._0_4_;
    auVar46._8_4_ = auVar295._8_4_ * auVar295._8_4_;
    auVar46._12_4_ = auVar295._12_4_ * auVar295._12_4_;
    auVar46._16_4_ = auVar295._16_4_ * auVar295._16_4_;
    auVar46._20_4_ = auVar295._20_4_ * auVar295._20_4_;
    auVar46._24_4_ = auVar295._24_4_ * auVar295._24_4_;
    auVar46._28_4_ = local_240._28_4_;
    fVar220 = auVar288._0_4_;
    fVar222 = auVar288._4_4_;
    fVar224 = auVar288._8_4_;
    fVar193 = auVar288._12_4_;
    fVar194 = auVar288._16_4_;
    fVar195 = auVar288._20_4_;
    fVar196 = auVar288._24_4_;
    auVar47._4_4_ = auVar274._4_4_ * fVar222 * 4.0;
    auVar47._0_4_ = auVar274._0_4_ * fVar220 * 4.0;
    auVar47._8_4_ = auVar274._8_4_ * fVar224 * 4.0;
    auVar47._12_4_ = auVar274._12_4_ * fVar193 * 4.0;
    auVar47._16_4_ = auVar274._16_4_ * fVar194 * 4.0;
    auVar47._20_4_ = auVar274._20_4_ * fVar195 * 4.0;
    auVar47._24_4_ = auVar274._24_4_ * fVar196 * 4.0;
    auVar47._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(auVar46,auVar47);
    auVar115 = vcmpps_avx(auVar14,auVar120,5);
    local_2e0 = vandps_avx(auVar45,local_a80);
    local_300._0_4_ = fVar220 + fVar220;
    local_300._4_4_ = fVar222 + fVar222;
    local_300._8_4_ = fVar224 + fVar224;
    local_300._12_4_ = fVar193 + fVar193;
    local_300._16_4_ = fVar194 + fVar194;
    local_300._20_4_ = fVar195 + fVar195;
    local_300._24_4_ = fVar196 + fVar196;
    local_300._28_4_ = auVar288._28_4_ + auVar288._28_4_;
    local_860 = vandps_avx(auVar288,local_a80);
    auVar288 = ZEXT1632(auVar6);
    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar115 >> 0x7f,0) == '\0') &&
          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar115 >> 0xbf,0) == '\0') &&
        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar115[0x1f])
    {
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar204._8_4_ = 0xff800000;
      auVar204._0_8_ = 0xff800000ff800000;
      auVar204._12_4_ = 0xff800000;
      auVar204._16_4_ = 0xff800000;
      auVar204._20_4_ = 0xff800000;
      auVar204._24_4_ = 0xff800000;
      auVar204._28_4_ = 0xff800000;
    }
    else {
      auVar287 = vsqrtps_avx(auVar14);
      auVar286 = vrcpps_avx(local_300);
      auVar14 = vcmpps_avx(auVar14,auVar120,5);
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar286,local_300,auVar121);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar286,auVar286);
      uVar96 = CONCAT44(auVar295._4_4_,auVar295._0_4_);
      auVar296._0_8_ = uVar96 ^ 0x8000000080000000;
      auVar296._8_4_ = -auVar295._8_4_;
      auVar296._12_4_ = -auVar295._12_4_;
      auVar296._16_4_ = -auVar295._16_4_;
      auVar296._20_4_ = -auVar295._20_4_;
      auVar296._24_4_ = -auVar295._24_4_;
      auVar296._28_4_ = -auVar295._28_4_;
      auVar120 = vsubps_avx(auVar296,auVar287);
      auVar48._4_4_ = auVar120._4_4_ * auVar6._4_4_;
      auVar48._0_4_ = auVar120._0_4_ * auVar6._0_4_;
      auVar48._8_4_ = auVar120._8_4_ * auVar6._8_4_;
      auVar48._12_4_ = auVar120._12_4_ * auVar6._12_4_;
      auVar48._16_4_ = auVar120._16_4_ * 0.0;
      auVar48._20_4_ = auVar120._20_4_ * 0.0;
      auVar48._24_4_ = auVar120._24_4_ * 0.0;
      auVar48._28_4_ = auVar120._28_4_;
      auVar120 = vsubps_avx(auVar287,auVar295);
      auVar205._0_4_ = auVar120._0_4_ * auVar6._0_4_;
      auVar205._4_4_ = auVar120._4_4_ * auVar6._4_4_;
      auVar205._8_4_ = auVar120._8_4_ * auVar6._8_4_;
      auVar205._12_4_ = auVar120._12_4_ * auVar6._12_4_;
      auVar205._16_4_ = auVar120._16_4_ * 0.0;
      auVar205._20_4_ = auVar120._20_4_ * 0.0;
      auVar205._24_4_ = auVar120._24_4_ * 0.0;
      auVar205._28_4_ = 0;
      auVar6 = vfmadd213ps_fma(auVar251,auVar48,auVar288);
      local_380 = auVar6._0_4_ * fVar212;
      fStack_37c = auVar6._4_4_ * fVar221;
      fStack_378 = auVar6._8_4_ * fVar223;
      fStack_374 = auVar6._12_4_ * fVar225;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar6 = vfmadd213ps_fma(auVar251,auVar205,auVar288);
      local_360 = auVar6._0_4_ * fVar212;
      fStack_35c = auVar6._4_4_ * fVar221;
      fStack_358 = auVar6._8_4_ * fVar223;
      fStack_354 = auVar6._12_4_ * fVar225;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x3f800000;
      auVar122._8_4_ = 0x7f800000;
      auVar122._0_8_ = 0x7f8000007f800000;
      auVar122._12_4_ = 0x7f800000;
      auVar122._16_4_ = 0x7f800000;
      auVar122._20_4_ = 0x7f800000;
      auVar122._24_4_ = 0x7f800000;
      auVar122._28_4_ = 0x7f800000;
      auVar280 = vblendvps_avx(auVar122,auVar48,auVar14);
      auVar123._8_4_ = 0xff800000;
      auVar123._0_8_ = 0xff800000ff800000;
      auVar123._12_4_ = 0xff800000;
      auVar123._16_4_ = 0xff800000;
      auVar123._20_4_ = 0xff800000;
      auVar123._24_4_ = 0xff800000;
      auVar123._28_4_ = 0xff800000;
      auVar204 = vblendvps_avx(auVar123,auVar205,auVar14);
      auVar120 = vmaxps_avx(local_720,local_2e0);
      auVar49._4_4_ = auVar120._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar120._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar120._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar120._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar120._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar120._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar120._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar120._28_4_;
      auVar120 = vcmpps_avx(local_860,auVar49,1);
      auVar286 = auVar14 & auVar120;
      if ((((((((auVar286 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar286 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar286 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar286 >> 0x7f,0) != '\0') ||
            (auVar286 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar286 >> 0xbf,0) != '\0') ||
          (auVar286 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar286[0x1f] < '\0') {
        auVar115 = vandps_avx(auVar120,auVar14);
        auVar120 = vcmpps_avx(auVar274,_DAT_01f7b000,2);
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar274 = vblendvps_avx(auVar130,auVar233,auVar120);
        auVar6 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar286 = vpmovsxwd_avx2(auVar6);
        auVar280 = vblendvps_avx(auVar280,auVar274,auVar286);
        auVar298._8_4_ = 0xff800000;
        auVar298._0_8_ = 0xff800000ff800000;
        auVar298._12_4_ = 0xff800000;
        auVar298._16_4_ = 0xff800000;
        auVar298._20_4_ = 0xff800000;
        auVar298._24_4_ = 0xff800000;
        auVar298._28_4_ = 0xff800000;
        auVar274 = vblendvps_avx(auVar298,auVar130,auVar120);
        auVar204 = vblendvps_avx(auVar204,auVar274,auVar286);
        auVar192._0_8_ = auVar115._0_8_ ^ 0xffffffffffffffff;
        auVar192._8_4_ = auVar115._8_4_ ^ 0xffffffff;
        auVar192._12_4_ = auVar115._12_4_ ^ 0xffffffff;
        auVar192._16_4_ = auVar115._16_4_ ^ 0xffffffff;
        auVar192._20_4_ = auVar115._20_4_ ^ 0xffffffff;
        auVar192._24_4_ = auVar115._24_4_ ^ 0xffffffff;
        auVar192._28_4_ = auVar115._28_4_ ^ 0xffffffff;
        auVar115 = vorps_avx(auVar120,auVar192);
        auVar115 = vandps_avx(auVar14,auVar115);
      }
    }
    auVar274 = local_840 & auVar115;
    if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar274 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar274 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar274 >> 0x7f,0) == '\0') &&
          (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar274 >> 0xbf,0) == '\0') &&
        (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar274[0x1f])
    {
LAB_01346dca:
      auVar269 = ZEXT3264(local_a80);
      auVar211 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_3a0 = ZEXT1632(auVar5);
      auVar269 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar240 = *(float *)(ray + k * 4 + 0x100) - (float)local_9b0._0_4_;
      auVar261._4_4_ = fVar240;
      auVar261._0_4_ = fVar240;
      auVar261._8_4_ = fVar240;
      auVar261._12_4_ = fVar240;
      auVar261._16_4_ = fVar240;
      auVar261._20_4_ = fVar240;
      auVar261._24_4_ = fVar240;
      auVar261._28_4_ = fVar240;
      auVar14 = vminps_avx(auVar261,auVar204);
      auVar50._4_4_ = fVar226 * auVar271._4_4_;
      auVar50._0_4_ = fVar241 * auVar271._0_4_;
      auVar50._8_4_ = fVar235 * auVar271._8_4_;
      auVar50._12_4_ = fVar236 * auVar271._12_4_;
      auVar50._16_4_ = fVar237 * auVar271._16_4_;
      auVar50._20_4_ = fVar238 * auVar271._20_4_;
      auVar50._24_4_ = fVar239 * auVar271._24_4_;
      auVar50._28_4_ = auVar174._28_4_;
      auVar5 = vfmadd213ps_fma(auVar13,auVar266,auVar50);
      auVar86._4_4_ = fStack_31c;
      auVar86._0_4_ = local_320;
      auVar86._8_4_ = fStack_318;
      auVar86._12_4_ = fStack_314;
      auVar86._16_4_ = fStack_310;
      auVar86._20_4_ = fStack_30c;
      auVar86._24_4_ = fStack_308;
      auVar86._28_4_ = fStack_304;
      auVar13 = vmaxps_avx(auVar86,auVar280);
      auVar6 = vfmadd213ps_fma(auVar124,local_8c0,ZEXT1632(auVar5));
      auVar244._0_4_ = (float)local_8a0._0_4_ * auVar271._0_4_;
      auVar244._4_4_ = (float)local_8a0._4_4_ * auVar271._4_4_;
      auVar244._8_4_ = fStack_898 * auVar271._8_4_;
      auVar244._12_4_ = fStack_894 * auVar271._12_4_;
      auVar244._16_4_ = fStack_890 * auVar271._16_4_;
      auVar244._20_4_ = fStack_88c * auVar271._20_4_;
      auVar244._24_4_ = fStack_888 * auVar271._24_4_;
      auVar244._28_4_ = 0;
      auVar5 = vfmadd231ps_fma(auVar244,_local_880,auVar266);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar5),local_8c0,_local_960);
      auVar274 = vandps_avx(local_a80,ZEXT1632(auVar7));
      auVar281._8_4_ = 0x219392ef;
      auVar281._0_8_ = 0x219392ef219392ef;
      auVar281._12_4_ = 0x219392ef;
      auVar281._16_4_ = 0x219392ef;
      auVar281._20_4_ = 0x219392ef;
      auVar281._24_4_ = 0x219392ef;
      auVar281._28_4_ = 0x219392ef;
      auVar174 = vcmpps_avx(auVar274,auVar281,1);
      auVar274 = vrcpps_avx(ZEXT1632(auVar7));
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = 0x3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar206._16_4_ = 0x3f800000;
      auVar206._20_4_ = 0x3f800000;
      auVar206._24_4_ = 0x3f800000;
      auVar206._28_4_ = 0x3f800000;
      auVar124 = ZEXT1632(auVar7);
      auVar5 = vfnmadd213ps_fma(auVar274,auVar124,auVar206);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar274,auVar274);
      auVar282._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar282._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar282._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar282._16_4_ = 0x80000000;
      auVar282._20_4_ = 0x80000000;
      auVar282._24_4_ = 0x80000000;
      auVar282._28_4_ = 0x80000000;
      auVar297._0_4_ = auVar5._0_4_ * -auVar6._0_4_;
      auVar297._4_4_ = auVar5._4_4_ * -auVar6._4_4_;
      auVar297._8_4_ = auVar5._8_4_ * -auVar6._8_4_;
      auVar297._12_4_ = auVar5._12_4_ * -auVar6._12_4_;
      auVar297._16_4_ = 0x80000000;
      auVar297._20_4_ = 0x80000000;
      auVar297._24_4_ = 0x80000000;
      auVar297._28_4_ = 0;
      auVar274 = vcmpps_avx(auVar124,auVar282,1);
      auVar274 = vorps_avx(auVar174,auVar274);
      auVar207._8_4_ = 0xff800000;
      auVar207._0_8_ = 0xff800000ff800000;
      auVar207._12_4_ = 0xff800000;
      auVar207._16_4_ = 0xff800000;
      auVar207._20_4_ = 0xff800000;
      auVar207._24_4_ = 0xff800000;
      auVar207._28_4_ = 0xff800000;
      auVar274 = vblendvps_avx(auVar297,auVar207,auVar274);
      auVar13 = vmaxps_avx(auVar13,auVar274);
      auVar274 = vcmpps_avx(auVar124,auVar282,6);
      auVar274 = vorps_avx(auVar174,auVar274);
      auVar208._8_4_ = 0x7f800000;
      auVar208._0_8_ = 0x7f8000007f800000;
      auVar208._12_4_ = 0x7f800000;
      auVar208._16_4_ = 0x7f800000;
      auVar208._20_4_ = 0x7f800000;
      auVar208._24_4_ = 0x7f800000;
      auVar208._28_4_ = 0x7f800000;
      auVar274 = vblendvps_avx(auVar297,auVar208,auVar274);
      auVar124 = vminps_avx(auVar14,auVar274);
      fVar241 = -local_900._0_4_;
      fVar226 = -local_900._4_4_;
      fVar235 = -local_900._8_4_;
      fVar236 = -local_900._12_4_;
      fVar237 = -local_900._16_4_;
      fVar238 = -local_900._20_4_;
      fVar239 = -local_900._24_4_;
      uStack_b84 = auVar141._28_4_;
      auVar253._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
      auVar253._8_4_ = -auVar141._8_4_;
      auVar253._12_4_ = -auVar141._12_4_;
      auVar253._16_4_ = -auVar141._16_4_;
      auVar253._20_4_ = -auVar141._20_4_;
      auVar253._24_4_ = -auVar141._24_4_;
      auVar253._28_4_ = uStack_b84 ^ 0x80000000;
      auVar274 = vsubps_avx(ZEXT832(0) << 0x20,auVar116);
      auVar174 = vsubps_avx(ZEXT832(0) << 0x20,_local_a20);
      auVar51._4_4_ = auVar174._4_4_ * fVar226;
      auVar51._0_4_ = auVar174._0_4_ * fVar241;
      auVar51._8_4_ = auVar174._8_4_ * fVar235;
      auVar51._12_4_ = auVar174._12_4_ * fVar236;
      auVar51._16_4_ = auVar174._16_4_ * fVar237;
      auVar51._20_4_ = auVar174._20_4_ * fVar238;
      auVar51._24_4_ = auVar174._24_4_ * fVar239;
      auVar51._28_4_ = auVar174._28_4_;
      auVar5 = vfmadd231ps_fma(auVar51,auVar253,auVar274);
      auVar262._0_8_ = local_8e0._0_8_ ^ 0x8000000080000000;
      auVar262._8_4_ = -local_8e0._8_4_;
      auVar262._12_4_ = -local_8e0._12_4_;
      auVar262._16_4_ = -local_8e0._16_4_;
      auVar262._20_4_ = -local_8e0._20_4_;
      auVar262._24_4_ = -local_8e0._24_4_;
      auVar262._28_4_ = local_8e0._28_4_ ^ 0x80000000;
      auVar274 = vsubps_avx(ZEXT832(0) << 0x20,auVar245);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar262,auVar274);
      auVar52._4_4_ = (float)local_8a0._4_4_ * fVar226;
      auVar52._0_4_ = (float)local_8a0._0_4_ * fVar241;
      auVar52._8_4_ = fStack_898 * fVar235;
      auVar52._12_4_ = fStack_894 * fVar236;
      auVar52._16_4_ = fStack_890 * fVar237;
      auVar52._20_4_ = fStack_88c * fVar238;
      auVar52._24_4_ = fStack_888 * fVar239;
      auVar52._28_4_ = local_900._28_4_ ^ 0x80000000;
      auVar5 = vfmadd231ps_fma(auVar52,_local_880,auVar253);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar262,_local_960);
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar274 = vandps_avx(ZEXT1632(auVar7),local_a80);
      auVar14 = vrcpps_avx(ZEXT1632(auVar7));
      auVar143._8_4_ = 0x219392ef;
      auVar143._0_8_ = 0x219392ef219392ef;
      auVar143._12_4_ = 0x219392ef;
      auVar143._16_4_ = 0x219392ef;
      auVar143._20_4_ = 0x219392ef;
      auVar143._24_4_ = 0x219392ef;
      auVar143._28_4_ = 0x219392ef;
      auVar174 = vcmpps_avx(auVar274,auVar143,1);
      auVar254 = ZEXT3264(auVar174);
      auVar245 = ZEXT1632(auVar7);
      auVar5 = vfnmadd213ps_fma(auVar14,auVar245,auVar229);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar14,auVar14);
      auVar263._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar263._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar263._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar263._16_4_ = 0x80000000;
      auVar263._20_4_ = 0x80000000;
      auVar263._24_4_ = 0x80000000;
      auVar263._28_4_ = 0x80000000;
      auVar53._4_4_ = auVar5._4_4_ * -auVar6._4_4_;
      auVar53._0_4_ = auVar5._0_4_ * -auVar6._0_4_;
      auVar53._8_4_ = auVar5._8_4_ * -auVar6._8_4_;
      auVar53._12_4_ = auVar5._12_4_ * -auVar6._12_4_;
      auVar53._16_4_ = 0x80000000;
      auVar53._20_4_ = 0x80000000;
      auVar53._24_4_ = 0x80000000;
      auVar53._28_4_ = 0x80000000;
      auVar274 = vcmpps_avx(auVar245,auVar263,1);
      auVar274 = vorps_avx(auVar174,auVar274);
      auVar144._8_4_ = 0xff800000;
      auVar144._0_8_ = 0xff800000ff800000;
      auVar144._12_4_ = 0xff800000;
      auVar144._16_4_ = 0xff800000;
      auVar144._20_4_ = 0xff800000;
      auVar144._24_4_ = 0xff800000;
      auVar144._28_4_ = 0xff800000;
      auVar274 = vblendvps_avx(auVar53,auVar144,auVar274);
      auVar13 = vmaxps_avx(auVar13,auVar274);
      auVar274 = vcmpps_avx(auVar245,auVar263,6);
      auVar274 = vorps_avx(auVar174,auVar274);
      auVar246._8_4_ = 0x7f800000;
      auVar246._0_8_ = 0x7f8000007f800000;
      auVar246._12_4_ = 0x7f800000;
      auVar246._16_4_ = 0x7f800000;
      auVar246._20_4_ = 0x7f800000;
      auVar246._24_4_ = 0x7f800000;
      auVar246._28_4_ = 0x7f800000;
      auVar274 = vblendvps_avx(auVar53,auVar246,auVar274);
      auVar247 = ZEXT3264(auVar274);
      auVar115 = vandps_avx(auVar115,local_840);
      local_3c0 = vminps_avx(auVar124,auVar274);
      auVar274 = vcmpps_avx(auVar13,local_3c0,2);
      auVar174 = auVar115 & auVar274;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar174 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar174 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar174[0x1f]) goto LAB_01346dca;
      auVar84._4_4_ = fStack_37c;
      auVar84._0_4_ = local_380;
      auVar84._8_4_ = fStack_378;
      auVar84._12_4_ = fStack_374;
      auVar84._16_4_ = uStack_370;
      auVar84._20_4_ = uStack_36c;
      auVar84._24_4_ = uStack_368;
      auVar84._28_4_ = uStack_364;
      auVar174 = vminps_avx(auVar84,auVar229);
      auVar247 = ZEXT864(0) << 0x20;
      auVar174 = vmaxps_avx(auVar174,ZEXT832(0) << 0x20);
      auVar85._4_4_ = fStack_35c;
      auVar85._0_4_ = local_360;
      auVar85._8_4_ = fStack_358;
      auVar85._12_4_ = fStack_354;
      auVar85._16_4_ = uStack_350;
      auVar85._20_4_ = uStack_34c;
      auVar85._24_4_ = uStack_348;
      auVar85._28_4_ = uStack_344;
      auVar124 = vminps_avx(auVar85,auVar229);
      auVar124 = vmaxps_avx(auVar124,ZEXT832(0) << 0x20);
      auVar54._4_4_ = (auVar174._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar174._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar174._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar174._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar174._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar174._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar174._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar174._28_4_ + 7.0;
      auVar5 = vfmadd213ps_fma(auVar54,local_a40,auVar216);
      auVar55._4_4_ = (auVar124._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar124._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar124._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar124._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar124._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar124._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar124._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar124._28_4_ + 7.0;
      auVar6 = vfmadd213ps_fma(auVar55,local_a40,auVar216);
      auVar174 = vminps_avx(local_a60,local_920);
      auVar124 = vminps_avx(local_940,auVar169);
      auVar174 = vminps_avx(auVar174,auVar124);
      auVar119 = vsubps_avx(auVar174,auVar119);
      auVar274 = vandps_avx(auVar274,auVar115);
      local_1a0 = ZEXT1632(auVar5);
      local_1c0 = ZEXT1632(auVar6);
      auVar56._4_4_ = auVar119._4_4_ * 0.99999976;
      auVar56._0_4_ = auVar119._0_4_ * 0.99999976;
      auVar56._8_4_ = auVar119._8_4_ * 0.99999976;
      auVar56._12_4_ = auVar119._12_4_ * 0.99999976;
      auVar56._16_4_ = auVar119._16_4_ * 0.99999976;
      auVar56._20_4_ = auVar119._20_4_ * 0.99999976;
      auVar56._24_4_ = auVar119._24_4_ * 0.99999976;
      auVar56._28_4_ = auVar115._28_4_;
      auVar115 = vmaxps_avx(ZEXT832(0) << 0x20,auVar56);
      auVar57._4_4_ = auVar115._4_4_ * auVar115._4_4_;
      auVar57._0_4_ = auVar115._0_4_ * auVar115._0_4_;
      auVar57._8_4_ = auVar115._8_4_ * auVar115._8_4_;
      auVar57._12_4_ = auVar115._12_4_ * auVar115._12_4_;
      auVar57._16_4_ = auVar115._16_4_ * auVar115._16_4_;
      auVar57._20_4_ = auVar115._20_4_ * auVar115._20_4_;
      auVar57._24_4_ = auVar115._24_4_ * auVar115._24_4_;
      auVar57._28_4_ = auVar115._28_4_;
      auVar119 = vsubps_avx(auVar230,auVar57);
      auVar58._4_4_ = auVar119._4_4_ * fVar222 * 4.0;
      auVar58._0_4_ = auVar119._0_4_ * fVar220 * 4.0;
      auVar58._8_4_ = auVar119._8_4_ * fVar224 * 4.0;
      auVar58._12_4_ = auVar119._12_4_ * fVar193 * 4.0;
      auVar58._16_4_ = auVar119._16_4_ * fVar194 * 4.0;
      auVar58._20_4_ = auVar119._20_4_ * fVar195 * 4.0;
      auVar58._24_4_ = auVar119._24_4_ * fVar196 * 4.0;
      auVar58._28_4_ = auVar115._28_4_;
      auVar115 = vsubps_avx(auVar46,auVar58);
      local_ce0 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,5);
      if ((((((((local_ce0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_ce0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_ce0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_ce0 >> 0x7f,0) == '\0') &&
            (local_ce0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_ce0 >> 0xbf,0) == '\0') &&
          (local_ce0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_ce0[0x1f]) {
        auVar230 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar259 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar124 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar288 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar155 = ZEXT864(0) << 0x20;
        auVar272._8_4_ = 0x7f800000;
        auVar272._0_8_ = 0x7f8000007f800000;
        auVar272._12_4_ = 0x7f800000;
        auVar272._16_4_ = 0x7f800000;
        auVar272._20_4_ = 0x7f800000;
        auVar272._24_4_ = 0x7f800000;
        auVar272._28_4_ = 0x7f800000;
        auVar275._8_4_ = 0xff800000;
        auVar275._0_8_ = 0xff800000ff800000;
        auVar275._12_4_ = 0xff800000;
        auVar275._16_4_ = 0xff800000;
        auVar275._20_4_ = 0xff800000;
        auVar275._24_4_ = 0xff800000;
        auVar275._28_4_ = 0xff800000;
      }
      else {
        auVar174 = vrcpps_avx(local_300);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar125._16_4_ = 0x3f800000;
        auVar125._20_4_ = 0x3f800000;
        auVar125._24_4_ = 0x3f800000;
        auVar125._28_4_ = 0x3f800000;
        auVar5 = vfnmadd213ps_fma(local_300,auVar174,auVar125);
        auVar124 = vsqrtps_avx(auVar115);
        auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar174,auVar174);
        uVar96 = CONCAT44(auVar295._4_4_,auVar295._0_4_);
        auVar218._0_8_ = uVar96 ^ 0x8000000080000000;
        auVar218._8_4_ = -auVar295._8_4_;
        auVar218._12_4_ = -auVar295._12_4_;
        auVar218._16_4_ = -auVar295._16_4_;
        auVar218._20_4_ = -auVar295._20_4_;
        auVar218._24_4_ = -auVar295._24_4_;
        auVar218._28_4_ = -auVar295._28_4_;
        auVar174 = vsubps_avx(auVar218,auVar124);
        auVar124 = vsubps_avx(auVar124,auVar295);
        fVar220 = auVar174._0_4_ * auVar5._0_4_;
        fVar222 = auVar174._4_4_ * auVar5._4_4_;
        auVar59._4_4_ = fVar222;
        auVar59._0_4_ = fVar220;
        fVar224 = auVar174._8_4_ * auVar5._8_4_;
        auVar59._8_4_ = fVar224;
        fVar193 = auVar174._12_4_ * auVar5._12_4_;
        auVar59._12_4_ = fVar193;
        fVar194 = auVar174._16_4_ * 0.0;
        auVar59._16_4_ = fVar194;
        fVar195 = auVar174._20_4_ * 0.0;
        auVar59._20_4_ = fVar195;
        fVar196 = auVar174._24_4_ * 0.0;
        auVar59._24_4_ = fVar196;
        auVar59._28_4_ = auVar174._28_4_;
        fVar241 = auVar124._0_4_ * auVar5._0_4_;
        fVar226 = auVar124._4_4_ * auVar5._4_4_;
        auVar60._4_4_ = fVar226;
        auVar60._0_4_ = fVar241;
        fVar235 = auVar124._8_4_ * auVar5._8_4_;
        auVar60._8_4_ = fVar235;
        fVar236 = auVar124._12_4_ * auVar5._12_4_;
        auVar60._12_4_ = fVar236;
        fVar237 = auVar124._16_4_ * 0.0;
        auVar60._16_4_ = fVar237;
        fVar238 = auVar124._20_4_ * 0.0;
        auVar60._20_4_ = fVar238;
        fVar239 = auVar124._24_4_ * 0.0;
        auVar60._24_4_ = fVar239;
        auVar60._28_4_ = 0x80000000;
        auVar5 = vfmadd213ps_fma(auVar251,auVar59,auVar288);
        auVar6 = vfmadd213ps_fma(auVar251,auVar60,auVar288);
        auVar174 = ZEXT1632(CONCAT412(fVar225 * auVar5._12_4_,
                                      CONCAT48(fVar223 * auVar5._8_4_,
                                               CONCAT44(fVar221 * auVar5._4_4_,
                                                        fVar212 * auVar5._0_4_))));
        auVar124 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar225,
                                      CONCAT48(auVar6._8_4_ * fVar223,
                                               CONCAT44(auVar6._4_4_ * fVar221,
                                                        auVar6._0_4_ * fVar212))));
        auVar5 = vfmadd213ps_fma(local_2a0,auVar174,auVar260);
        auVar6 = vfmadd213ps_fma(local_2a0,auVar124,auVar260);
        auVar7 = vfmadd213ps_fma(local_2c0,auVar174,auVar142);
        auVar104 = vfmadd213ps_fma(local_2c0,auVar124,auVar142);
        auVar213 = vfmadd213ps_fma(auVar174,local_280,auVar170);
        auVar160 = vfmadd213ps_fma(local_280,auVar124,auVar170);
        auVar61._4_4_ = (float)local_960._4_4_ * fVar222;
        auVar61._0_4_ = (float)local_960._0_4_ * fVar220;
        auVar61._8_4_ = fStack_958 * fVar224;
        auVar61._12_4_ = fStack_954 * fVar193;
        auVar61._16_4_ = fStack_950 * fVar194;
        auVar61._20_4_ = fStack_94c * fVar195;
        auVar61._24_4_ = fStack_948 * fVar196;
        auVar61._28_4_ = 0;
        auVar124 = vsubps_avx(auVar61,ZEXT1632(auVar5));
        auVar145._0_4_ = (float)local_880._0_4_ * fVar220;
        auVar145._4_4_ = (float)local_880._4_4_ * fVar222;
        auVar145._8_4_ = fStack_878 * fVar224;
        auVar145._12_4_ = fStack_874 * fVar193;
        auVar145._16_4_ = fStack_870 * fVar194;
        auVar145._20_4_ = fStack_86c * fVar195;
        auVar145._24_4_ = fStack_868 * fVar196;
        auVar145._28_4_ = 0;
        auVar288 = vsubps_avx(auVar145,ZEXT1632(auVar7));
        auVar171._0_4_ = (float)local_8a0._0_4_ * fVar220;
        auVar171._4_4_ = (float)local_8a0._4_4_ * fVar222;
        auVar171._8_4_ = fStack_898 * fVar224;
        auVar171._12_4_ = fStack_894 * fVar193;
        auVar171._16_4_ = fStack_890 * fVar194;
        auVar171._20_4_ = fStack_88c * fVar195;
        auVar171._24_4_ = fStack_888 * fVar196;
        auVar171._28_4_ = 0;
        auVar174 = vsubps_avx(auVar171,ZEXT1632(auVar213));
        auVar155 = ZEXT3264(auVar174);
        auVar231._0_4_ = fVar241 * (float)local_960._0_4_;
        auVar231._4_4_ = fVar226 * (float)local_960._4_4_;
        auVar231._8_4_ = fVar235 * fStack_958;
        auVar231._12_4_ = fVar236 * fStack_954;
        auVar231._16_4_ = fVar237 * fStack_950;
        auVar231._20_4_ = fVar238 * fStack_94c;
        auVar231._24_4_ = fVar239 * fStack_948;
        auVar231._28_4_ = 0;
        auVar174 = vsubps_avx(auVar231,ZEXT1632(auVar6));
        auVar247 = ZEXT3264(auVar174);
        auVar62._4_4_ = (float)local_880._4_4_ * fVar226;
        auVar62._0_4_ = (float)local_880._0_4_ * fVar241;
        auVar62._8_4_ = fStack_878 * fVar235;
        auVar62._12_4_ = fStack_874 * fVar236;
        auVar62._16_4_ = fStack_870 * fVar237;
        auVar62._20_4_ = fStack_86c * fVar238;
        auVar62._24_4_ = fStack_868 * fVar239;
        auVar62._28_4_ = 0;
        auVar230 = vsubps_avx(auVar62,ZEXT1632(auVar104));
        auVar63._4_4_ = (float)local_8a0._4_4_ * fVar226;
        auVar63._0_4_ = (float)local_8a0._0_4_ * fVar241;
        auVar63._8_4_ = fStack_898 * fVar235;
        auVar63._12_4_ = fStack_894 * fVar236;
        auVar63._16_4_ = fStack_890 * fVar237;
        auVar63._20_4_ = fStack_88c * fVar238;
        auVar63._24_4_ = fStack_888 * fVar239;
        auVar63._28_4_ = uVar100;
        auVar174 = vsubps_avx(auVar63,ZEXT1632(auVar160));
        auVar259 = auVar174._0_28_;
        auVar115 = vcmpps_avx(auVar115,_DAT_01f7b000,5);
        auVar273._8_4_ = 0x7f800000;
        auVar273._0_8_ = 0x7f8000007f800000;
        auVar273._12_4_ = 0x7f800000;
        auVar273._16_4_ = 0x7f800000;
        auVar273._20_4_ = 0x7f800000;
        auVar273._24_4_ = 0x7f800000;
        auVar273._28_4_ = 0x7f800000;
        auVar272 = vblendvps_avx(auVar273,auVar59,auVar115);
        auVar174 = vmaxps_avx(local_720,local_2e0);
        auVar64._4_4_ = auVar174._4_4_ * 1.9073486e-06;
        auVar64._0_4_ = auVar174._0_4_ * 1.9073486e-06;
        auVar64._8_4_ = auVar174._8_4_ * 1.9073486e-06;
        auVar64._12_4_ = auVar174._12_4_ * 1.9073486e-06;
        auVar64._16_4_ = auVar174._16_4_ * 1.9073486e-06;
        auVar64._20_4_ = auVar174._20_4_ * 1.9073486e-06;
        auVar64._24_4_ = auVar174._24_4_ * 1.9073486e-06;
        auVar64._28_4_ = auVar174._28_4_;
        auVar174 = vcmpps_avx(local_860,auVar64,1);
        auVar276._8_4_ = 0xff800000;
        auVar276._0_8_ = 0xff800000ff800000;
        auVar276._12_4_ = 0xff800000;
        auVar276._16_4_ = 0xff800000;
        auVar276._20_4_ = 0xff800000;
        auVar276._24_4_ = 0xff800000;
        auVar276._28_4_ = 0xff800000;
        auVar275 = vblendvps_avx(auVar276,auVar60,auVar115);
        auVar14 = auVar115 & auVar174;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar174 = vandps_avx(auVar115,auVar174);
          auVar14 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,2);
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          auVar299._8_4_ = 0x7f800000;
          auVar299._0_8_ = 0x7f8000007f800000;
          auVar299._12_4_ = 0x7f800000;
          auVar299._16_4_ = 0x7f800000;
          auVar299._20_4_ = 0x7f800000;
          auVar299._24_4_ = 0x7f800000;
          auVar299._28_4_ = 0x7f800000;
          auVar119 = vblendvps_avx(auVar299,auVar289,auVar14);
          auVar5 = vpackssdw_avx(auVar174._0_16_,auVar174._16_16_);
          auVar245 = vpmovsxwd_avx2(auVar5);
          auVar272 = vblendvps_avx(auVar272,auVar119,auVar245);
          auVar210._8_4_ = 0xff800000;
          auVar210._0_8_ = 0xff800000ff800000;
          auVar210._12_4_ = 0xff800000;
          auVar210._16_4_ = 0xff800000;
          auVar210._20_4_ = 0xff800000;
          auVar210._24_4_ = 0xff800000;
          auVar210._28_4_ = 0xff800000;
          auVar300._8_4_ = 0x7f800000;
          auVar300._0_8_ = 0x7f8000007f800000;
          auVar300._12_4_ = 0x7f800000;
          auVar300._16_4_ = 0x7f800000;
          auVar300._20_4_ = 0x7f800000;
          auVar300._24_4_ = 0x7f800000;
          auVar300._28_4_ = 0x7f800000;
          auVar119 = vblendvps_avx(auVar210,auVar300,auVar14);
          auVar275 = vblendvps_avx(auVar275,auVar119,auVar245);
          auVar219._0_8_ = auVar174._0_8_ ^ 0xffffffffffffffff;
          auVar219._8_4_ = auVar174._8_4_ ^ 0xffffffff;
          auVar219._12_4_ = auVar174._12_4_ ^ 0xffffffff;
          auVar219._16_4_ = auVar174._16_4_ ^ 0xffffffff;
          auVar219._20_4_ = auVar174._20_4_ ^ 0xffffffff;
          auVar219._24_4_ = auVar174._24_4_ ^ 0xffffffff;
          auVar219._28_4_ = auVar174._28_4_ ^ 0xffffffff;
          auVar119 = vorps_avx(auVar14,auVar219);
          local_ce0 = vandps_avx(auVar115,auVar119);
        }
      }
      local_540 = auVar13;
      local_520 = vminps_avx(local_3c0,auVar272);
      auVar119 = vmaxps_avx(auVar13,auVar275);
      _local_3e0 = auVar119;
      auVar115 = vcmpps_avx(auVar13,local_520,2);
      local_7c0 = vandps_avx(auVar115,auVar274);
      auVar277 = ZEXT3264(local_7c0);
      auVar115 = vcmpps_avx(auVar119,local_3c0,2);
      auVar115 = vandps_avx(auVar115,auVar274);
      auVar274 = vorps_avx(auVar115,local_7c0);
      auVar254 = ZEXT3264(_local_960);
      if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar274 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar274 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar274 >> 0x7f,0) == '\0') &&
            (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar274 >> 0xbf,0) == '\0') &&
          (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar274[0x1f]) goto LAB_01346dca;
      auVar65._4_4_ = (float)local_8a0._4_4_ * auVar259._4_4_;
      auVar65._0_4_ = (float)local_8a0._0_4_ * auVar259._0_4_;
      auVar65._8_4_ = fStack_898 * auVar259._8_4_;
      auVar65._12_4_ = fStack_894 * auVar259._12_4_;
      auVar65._16_4_ = fStack_890 * auVar259._16_4_;
      auVar65._20_4_ = fStack_88c * auVar259._20_4_;
      auVar65._24_4_ = fStack_888 * auVar259._24_4_;
      auVar65._28_4_ = auVar274._28_4_;
      auVar5 = vfmadd213ps_fma(auVar230,_local_880,auVar65);
      auVar5 = vfmadd213ps_fma(auVar247._0_32_,_local_960,ZEXT1632(auVar5));
      auVar247 = ZEXT1664(auVar5);
      auVar190._0_8_ = local_ce0._0_8_ ^ 0xffffffffffffffff;
      auVar190._8_4_ = local_ce0._8_4_ ^ 0xffffffff;
      auVar190._12_4_ = local_ce0._12_4_ ^ 0xffffffff;
      auVar190._16_4_ = local_ce0._16_4_ ^ 0xffffffff;
      auVar190._20_4_ = local_ce0._20_4_ ^ 0xffffffff;
      auVar190._24_4_ = local_ce0._24_4_ ^ 0xffffffff;
      auVar190._28_4_ = local_ce0._28_4_ ^ 0xffffffff;
      auVar274 = vandps_avx(ZEXT1632(auVar5),local_a80);
      auVar232._8_4_ = 0x3e99999a;
      auVar232._0_8_ = 0x3e99999a3e99999a;
      auVar232._12_4_ = 0x3e99999a;
      auVar232._16_4_ = 0x3e99999a;
      auVar232._20_4_ = 0x3e99999a;
      auVar232._24_4_ = 0x3e99999a;
      auVar232._28_4_ = 0x3e99999a;
      auVar274 = vcmpps_avx(auVar274,auVar232,1);
      local_800 = vorps_avx(auVar274,auVar190);
      auVar234._0_4_ = (float)local_8a0._0_4_ * auVar155._0_4_;
      auVar234._4_4_ = (float)local_8a0._4_4_ * auVar155._4_4_;
      auVar234._8_4_ = fStack_898 * auVar155._8_4_;
      auVar234._12_4_ = fStack_894 * auVar155._12_4_;
      auVar234._16_4_ = fStack_890 * auVar155._16_4_;
      auVar234._20_4_ = fStack_88c * auVar155._20_4_;
      auVar234._28_36_ = auVar155._28_36_;
      auVar234._24_4_ = fStack_888 * auVar155._24_4_;
      auVar5 = vfmadd213ps_fma(auVar288,_local_880,auVar234._0_32_);
      auVar5 = vfmadd213ps_fma(auVar124,_local_960,ZEXT1632(auVar5));
      auVar274 = vandps_avx(ZEXT1632(auVar5),local_a80);
      auVar274 = vcmpps_avx(auVar274,auVar232,1);
      auVar274 = vorps_avx(auVar274,auVar190);
      auVar147._8_4_ = 3;
      auVar147._0_8_ = 0x300000003;
      auVar147._12_4_ = 3;
      auVar147._16_4_ = 3;
      auVar147._20_4_ = 3;
      auVar147._24_4_ = 3;
      auVar147._28_4_ = 3;
      auVar173._8_4_ = 2;
      auVar173._0_8_ = 0x200000002;
      auVar173._12_4_ = 2;
      auVar173._16_4_ = 2;
      auVar173._20_4_ = 2;
      auVar173._24_4_ = 2;
      auVar173._28_4_ = 2;
      auVar274 = vblendvps_avx(auVar173,auVar147,auVar274);
      local_820._4_4_ = local_ce4;
      local_820._0_4_ = local_ce4;
      local_820._8_4_ = local_ce4;
      local_820._12_4_ = local_ce4;
      local_820._16_4_ = local_ce4;
      local_820._20_4_ = local_ce4;
      local_820._24_4_ = local_ce4;
      local_820._28_4_ = local_ce4;
      local_7e0 = vpcmpgtd_avx2(auVar274,local_820);
      local_560 = vpandn_avx2(local_7e0,local_7c0);
      local_980._4_4_ = auVar13._4_4_ + fVar132;
      local_980._0_4_ = auVar13._0_4_ + fVar132;
      fStack_978 = auVar13._8_4_ + fVar132;
      fStack_974 = auVar13._12_4_ + fVar132;
      fStack_970 = auVar13._16_4_ + fVar132;
      fStack_96c = auVar13._20_4_ + fVar132;
      fStack_968 = auVar13._24_4_ + fVar132;
      fStack_964 = auVar13._28_4_ + fVar132;
      while( true ) {
        auVar274 = _local_3e0;
        fStack_b3c = auVar1._4_4_;
        fStack_b38 = auVar1._8_4_;
        fStack_b34 = auVar1._12_4_;
        if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_560 >> 0x7f,0) == '\0') &&
              (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_560 >> 0xbf,0) == '\0') &&
            (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_560[0x1f]) break;
        auVar148._8_4_ = 0x7f800000;
        auVar148._0_8_ = 0x7f8000007f800000;
        auVar148._12_4_ = 0x7f800000;
        auVar148._16_4_ = 0x7f800000;
        auVar148._20_4_ = 0x7f800000;
        auVar148._24_4_ = 0x7f800000;
        auVar148._28_4_ = 0x7f800000;
        auVar274 = vblendvps_avx(auVar148,auVar13,local_560);
        auVar174 = vshufps_avx(auVar274,auVar274,0xb1);
        auVar174 = vminps_avx(auVar274,auVar174);
        auVar124 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar124);
        auVar124 = vpermpd_avx2(auVar174,0x4e);
        auVar174 = vminps_avx(auVar174,auVar124);
        auVar174 = vcmpps_avx(auVar274,auVar174,0);
        auVar124 = local_560 & auVar174;
        auVar274 = local_560;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          auVar274 = vandps_avx(auVar174,local_560);
        }
        uVar92 = vmovmskps_avx(auVar274);
        iVar91 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar91 = iVar91 + 1;
        }
        uVar96 = (ulong)(uint)(iVar91 << 2);
        *(undefined4 *)(local_560 + uVar96) = 0;
        uVar92 = *(uint *)(local_1a0 + uVar96);
        uVar97 = *(uint *)(local_540 + uVar96);
        fVar212 = auVar11._0_4_;
        if ((float)local_a00._0_4_ < 0.0) {
          auVar247 = ZEXT1664(auVar247._0_16_);
          auVar254 = ZEXT1664(auVar254._0_16_);
          auVar277 = ZEXT1664(auVar277._0_16_);
          fVar212 = sqrtf((float)local_a00._0_4_);
          uVar96 = extraout_RAX;
        }
        auVar6 = vminps_avx(auVar2,auVar4);
        auVar5 = vmaxps_avx(auVar2,auVar4);
        auVar7 = vminps_avx(auVar3,auVar1);
        auVar104 = vminps_avx(auVar6,auVar7);
        auVar6 = vmaxps_avx(auVar3,auVar1);
        auVar7 = vmaxps_avx(auVar5,auVar6);
        local_8e0._8_4_ = 0x7fffffff;
        local_8e0._0_8_ = 0x7fffffff7fffffff;
        local_8e0._12_4_ = 0x7fffffff;
        auVar5 = vandps_avx(auVar104,local_8e0._0_16_);
        auVar6 = vandps_avx(auVar7,local_8e0._0_16_);
        auVar5 = vmaxps_avx(auVar5,auVar6);
        auVar6 = vmovshdup_avx(auVar5);
        auVar6 = vmaxss_avx(auVar6,auVar5);
        auVar5 = vshufpd_avx(auVar5,auVar5,1);
        auVar5 = vmaxss_avx(auVar5,auVar6);
        fVar220 = auVar5._0_4_ * 1.9073486e-06;
        local_900._0_4_ = fVar212 * 1.9073486e-06;
        local_940._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
        auVar5 = vinsertps_avx(ZEXT416(uVar97),ZEXT416(uVar92),0x10);
        for (uVar99 = 0; bVar90 = (byte)uVar96, uVar99 != 5; uVar99 = uVar99 + 1) {
          fVar225 = auVar5._0_4_;
          auVar106._4_4_ = fVar225;
          auVar106._0_4_ = fVar225;
          auVar106._8_4_ = fVar225;
          auVar106._12_4_ = fVar225;
          auVar104 = vfmadd213ps_fma(auVar106,local_9f0,_DAT_01f45a50);
          auVar7 = vmovshdup_avx(auVar5);
          fVar193 = auVar7._0_4_;
          fVar224 = 1.0 - fVar193;
          auVar107 = SUB6416(ZEXT464(0x40400000),0);
          auVar242 = SUB6416(ZEXT464(0xc0a00000),0);
          auVar213 = vfmadd213ss_fma(auVar107,auVar7,auVar242);
          auVar6 = vfmadd213ss_fma(auVar213,ZEXT416((uint)(fVar193 * fVar193)),
                                   SUB6416(ZEXT464(0x40000000),0));
          auVar160 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar224),auVar242);
          auVar160 = vfmadd213ss_fma(auVar160,ZEXT416((uint)(fVar224 * fVar224)),
                                     SUB6416(ZEXT464(0x40000000),0));
          fVar212 = fVar224 * fVar224 * -fVar193 * 0.5;
          fVar221 = auVar6._0_4_ * 0.5;
          fVar222 = auVar160._0_4_ * 0.5;
          fVar223 = fVar193 * fVar193 * -fVar224 * 0.5;
          auVar176._0_4_ = fVar223 * fVar175;
          auVar176._4_4_ = fVar223 * fStack_b3c;
          auVar176._8_4_ = fVar223 * fStack_b38;
          auVar176._12_4_ = fVar223 * fStack_b34;
          auVar197._4_4_ = fVar222;
          auVar197._0_4_ = fVar222;
          auVar197._8_4_ = fVar222;
          auVar197._12_4_ = fVar222;
          auVar6 = vfmadd132ps_fma(auVar197,auVar176,auVar3);
          auVar156._4_4_ = fVar221;
          auVar156._0_4_ = fVar221;
          auVar156._8_4_ = fVar221;
          auVar156._12_4_ = fVar221;
          auVar6 = vfmadd132ps_fma(auVar156,auVar6,auVar4);
          auVar177._4_4_ = fVar212;
          auVar177._0_4_ = fVar212;
          auVar177._8_4_ = fVar212;
          auVar177._12_4_ = fVar212;
          auVar6 = vfmadd132ps_fma(auVar177,auVar6,auVar2);
          auVar242 = vfmadd231ss_fma(auVar242,auVar7,ZEXT416(0x41100000));
          auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar7,ZEXT416(0x40800000));
          local_8c0._0_16_ = auVar6;
          auVar6 = vsubps_avx(auVar104,auVar6);
          _local_a20 = auVar6;
          auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
          auVar104 = vfmadd213ss_fma(auVar107,auVar7,ZEXT416(0xbf800000));
          fVar212 = auVar6._0_4_;
          if (fVar212 < 0.0) {
            local_a40._0_16_ = auVar242;
            local_a60._0_4_ = fVar224 * -2.0;
            auVar254._0_4_ = sqrtf(fVar212);
            auVar254._4_60_ = extraout_var;
            auVar213 = ZEXT416(auVar213._0_4_);
            auVar107 = auVar254._0_16_;
            uVar96 = extraout_RAX_00;
            fVar221 = (float)local_a60._0_4_;
            auVar242 = local_a40._0_16_;
          }
          else {
            auVar107 = vsqrtss_avx(auVar6,auVar6);
            fVar221 = fVar224 * -2.0;
          }
          auVar279 = vfmadd213ss_fma(auVar213,ZEXT416((uint)(fVar193 + fVar193)),
                                     ZEXT416((uint)(fVar193 * fVar193 * 3.0)));
          auVar163 = SUB6416(ZEXT464(0x40000000),0);
          auVar213 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar7,auVar163);
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224 * -3.0)),
                                     ZEXT416((uint)(fVar224 + fVar224)),auVar213);
          auVar111 = vfnmadd231ss_fma(ZEXT416((uint)(fVar193 * (fVar224 + fVar224))),
                                      ZEXT416((uint)fVar224),ZEXT416((uint)fVar224));
          auVar213 = vfmadd213ss_fma(ZEXT416((uint)fVar221),auVar7,
                                     ZEXT416((uint)(fVar193 * fVar193)));
          fVar221 = auVar105._0_4_ * 0.5;
          fVar222 = auVar213._0_4_ * 0.5;
          auVar157._0_4_ = fVar175 * fVar222;
          auVar157._4_4_ = fStack_b3c * fVar222;
          auVar157._8_4_ = fStack_b38 * fVar222;
          auVar157._12_4_ = fStack_b34 * fVar222;
          auVar133._4_4_ = fVar221;
          auVar133._0_4_ = fVar221;
          auVar133._8_4_ = fVar221;
          auVar133._12_4_ = fVar221;
          auVar213 = vfmadd213ps_fma(auVar133,auVar3,auVar157);
          fVar221 = auVar111._0_4_ * 0.5;
          fVar222 = auVar279._0_4_ * 0.5;
          auVar158._4_4_ = fVar222;
          auVar158._0_4_ = fVar222;
          auVar158._8_4_ = fVar222;
          auVar158._12_4_ = fVar222;
          auVar213 = vfmadd213ps_fma(auVar158,auVar4,auVar213);
          auVar264._4_4_ = fVar221;
          auVar264._0_4_ = fVar221;
          auVar264._8_4_ = fVar221;
          auVar264._12_4_ = fVar221;
          auVar279 = vfmadd213ps_fma(auVar264,auVar2,auVar213);
          auVar213 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0xc0400000),0),auVar163);
          local_b80 = auVar104._0_4_;
          auVar108._0_4_ = fVar175 * local_b80;
          auVar108._4_4_ = fStack_b3c * local_b80;
          auVar108._8_4_ = fStack_b38 * local_b80;
          auVar108._12_4_ = fStack_b34 * local_b80;
          local_ae0 = auVar160._0_4_;
          auVar134._4_4_ = local_ae0;
          auVar134._0_4_ = local_ae0;
          auVar134._8_4_ = local_ae0;
          auVar134._12_4_ = local_ae0;
          auVar7 = vfmadd213ps_fma(auVar134,auVar3,auVar108);
          uVar100 = auVar242._0_4_;
          auVar159._4_4_ = uVar100;
          auVar159._0_4_ = uVar100;
          auVar159._8_4_ = uVar100;
          auVar159._12_4_ = uVar100;
          auVar7 = vfmadd213ps_fma(auVar159,auVar4,auVar7);
          auVar104 = vdpps_avx(auVar279,auVar279,0x7f);
          uVar100 = auVar213._0_4_;
          auVar135._4_4_ = uVar100;
          auVar135._0_4_ = uVar100;
          auVar135._8_4_ = uVar100;
          auVar135._12_4_ = uVar100;
          auVar160 = vfmadd213ps_fma(auVar135,auVar2,auVar7);
          auVar7 = vblendps_avx(auVar104,_DAT_01f45a50,0xe);
          auVar213 = vrsqrtss_avx(auVar7,auVar7);
          fVar223 = auVar104._0_4_;
          fVar221 = auVar213._0_4_;
          auVar213 = vdpps_avx(auVar279,auVar160,0x7f);
          fVar221 = fVar221 * 1.5 + fVar223 * -0.5 * fVar221 * fVar221 * fVar221;
          auVar136._0_4_ = auVar160._0_4_ * fVar223;
          auVar136._4_4_ = auVar160._4_4_ * fVar223;
          auVar136._8_4_ = auVar160._8_4_ * fVar223;
          auVar136._12_4_ = auVar160._12_4_ * fVar223;
          fVar222 = auVar213._0_4_;
          auVar214._0_4_ = auVar279._0_4_ * fVar222;
          auVar214._4_4_ = auVar279._4_4_ * fVar222;
          fVar224 = auVar279._8_4_;
          auVar214._8_4_ = fVar224 * fVar222;
          fVar193 = auVar279._12_4_;
          auVar214._12_4_ = fVar193 * fVar222;
          auVar213 = vsubps_avx(auVar136,auVar214);
          auVar7 = vrcpss_avx(auVar7,auVar7);
          auVar160 = vfnmadd213ss_fma(auVar7,auVar104,auVar163);
          fVar222 = auVar7._0_4_ * auVar160._0_4_;
          auVar7 = vmaxss_avx(ZEXT416((uint)fVar220),
                              ZEXT416((uint)(fVar225 * (float)local_900._0_4_)));
          auVar269 = ZEXT1664(auVar7);
          auVar243._0_8_ = auVar279._0_8_ ^ 0x8000000080000000;
          auVar243._8_4_ = -fVar224;
          auVar243._12_4_ = -fVar193;
          auVar178._0_4_ = fVar221 * auVar213._0_4_ * fVar222;
          auVar178._4_4_ = fVar221 * auVar213._4_4_ * fVar222;
          auVar178._8_4_ = fVar221 * auVar213._8_4_ * fVar222;
          auVar178._12_4_ = fVar221 * auVar213._12_4_ * fVar222;
          auVar249._0_4_ = auVar279._0_4_ * fVar221;
          auVar249._4_4_ = auVar279._4_4_ * fVar221;
          auVar249._8_4_ = fVar224 * fVar221;
          auVar249._12_4_ = fVar193 * fVar221;
          if (fVar223 < -fVar223) {
            fVar221 = sqrtf(fVar223);
            auVar269 = ZEXT464(auVar7._0_4_);
            auVar107 = ZEXT416(auVar107._0_4_);
            uVar96 = extraout_RAX_01;
          }
          else {
            auVar104 = vsqrtss_avx(auVar104,auVar104);
            fVar221 = auVar104._0_4_;
          }
          auVar254 = ZEXT1664(auVar249);
          auVar104 = vdpps_avx(_local_a20,auVar249,0x7f);
          auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar220),auVar107,auVar269._0_16_);
          auVar213 = vdpps_avx(auVar243,auVar249,0x7f);
          auVar160 = vdpps_avx(_local_a20,auVar178,0x7f);
          auVar242 = vdpps_avx(local_9f0,auVar249,0x7f);
          auVar105 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                     ZEXT416((uint)(fVar220 / fVar221)),auVar105);
          fVar221 = auVar213._0_4_ + auVar160._0_4_;
          fVar223 = auVar104._0_4_;
          auVar109._0_4_ = fVar223 * fVar223;
          auVar109._4_4_ = auVar104._4_4_ * auVar104._4_4_;
          auVar109._8_4_ = auVar104._8_4_ * auVar104._8_4_;
          auVar109._12_4_ = auVar104._12_4_ * auVar104._12_4_;
          auVar213 = vdpps_avx(_local_a20,auVar243,0x7f);
          auVar247 = ZEXT1664(auVar213);
          auVar107 = vsubps_avx(auVar6,auVar109);
          auVar160 = vrsqrtss_avx(auVar107,auVar107);
          fVar224 = auVar107._0_4_;
          fVar222 = auVar160._0_4_;
          fVar222 = fVar222 * 1.5 + fVar224 * -0.5 * fVar222 * fVar222 * fVar222;
          auVar160 = vdpps_avx(_local_a20,local_9f0,0x7f);
          auVar111 = vfnmadd231ss_fma(auVar213,auVar104,ZEXT416((uint)fVar221));
          auVar160 = vfnmadd231ss_fma(auVar160,auVar104,auVar242);
          if (fVar224 < 0.0) {
            local_a40._0_16_ = auVar111;
            local_a60._0_4_ = fVar222;
            local_920._0_16_ = auVar160;
            auVar247 = ZEXT1664(auVar213);
            auVar254 = ZEXT1664(auVar249);
            fVar224 = sqrtf(fVar224);
            auVar269 = ZEXT464(auVar7._0_4_);
            uVar96 = extraout_RAX_02;
            fVar222 = (float)local_a60._0_4_;
            auVar160 = local_920._0_16_;
            auVar111 = local_a40._0_16_;
          }
          else {
            auVar7 = vsqrtss_avx(auVar107,auVar107);
            fVar224 = auVar7._0_4_;
          }
          auVar277 = ZEXT1664(auVar104);
          auVar7 = vpermilps_avx(local_8c0._0_16_,0xff);
          fVar224 = fVar224 - auVar7._0_4_;
          auVar107 = vshufps_avx(auVar279,auVar279,0xff);
          auVar7 = vfmsub213ss_fma(auVar111,ZEXT416((uint)fVar222),auVar107);
          auVar179._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
          auVar179._8_4_ = auVar242._8_4_ ^ 0x80000000;
          auVar179._12_4_ = auVar242._12_4_ ^ 0x80000000;
          auVar198._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
          auVar198._8_4_ = auVar7._8_4_ ^ 0x80000000;
          auVar198._12_4_ = auVar7._12_4_ ^ 0x80000000;
          auVar160 = ZEXT416((uint)(auVar160._0_4_ * fVar222));
          auVar213 = vfmsub231ss_fma(ZEXT416((uint)(auVar242._0_4_ * auVar7._0_4_)),
                                     ZEXT416((uint)fVar221),auVar160);
          auVar7 = vinsertps_avx(auVar198,auVar160,0x1c);
          uVar100 = auVar213._0_4_;
          auVar199._4_4_ = uVar100;
          auVar199._0_4_ = uVar100;
          auVar199._8_4_ = uVar100;
          auVar199._12_4_ = uVar100;
          auVar7 = vdivps_avx(auVar7,auVar199);
          auVar213 = vinsertps_avx(ZEXT416((uint)fVar221),auVar179,0x10);
          auVar213 = vdivps_avx(auVar213,auVar199);
          auVar161._0_4_ = fVar223 * auVar7._0_4_ + fVar224 * auVar213._0_4_;
          auVar161._4_4_ = fVar223 * auVar7._4_4_ + fVar224 * auVar213._4_4_;
          auVar161._8_4_ = fVar223 * auVar7._8_4_ + fVar224 * auVar213._8_4_;
          auVar161._12_4_ = fVar223 * auVar7._12_4_ + fVar224 * auVar213._12_4_;
          auVar5 = vsubps_avx(auVar5,auVar161);
          auVar7 = vandps_avx(auVar104,local_8e0._0_16_);
          if (auVar7._0_4_ < auVar105._0_4_) {
            auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar105._0_4_ + auVar269._0_4_)),
                                       local_940._0_16_,ZEXT416(0x36000000));
            auVar7 = vandps_avx(ZEXT416((uint)fVar224),local_8e0._0_16_);
            if (auVar7._0_4_ < auVar104._0_4_) {
              bVar101 = uVar99 < 5;
              fVar220 = auVar5._0_4_ + (float)local_9b0._0_4_;
              if (fVar220 < fVar102) {
                bVar90 = 0;
                goto LAB_01347711;
              }
              fVar221 = *(float *)(ray + k * 4 + 0x100);
              auVar277 = ZEXT464((uint)fVar221);
              if (fVar220 <= fVar221) {
                auVar5 = vmovshdup_avx(auVar5);
                bVar90 = 0;
                if ((auVar5._0_4_ < 0.0) || (1.0 < auVar5._0_4_)) goto LAB_01347711;
                auVar6 = vrsqrtss_avx(auVar6,auVar6);
                fVar222 = auVar6._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar93].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar90 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01347711;
                  fVar212 = fVar222 * 1.5 + fVar212 * -0.5 * fVar222 * fVar222 * fVar222;
                  auVar180._0_4_ = fVar212 * (float)local_a20._0_4_;
                  auVar180._4_4_ = fVar212 * (float)local_a20._4_4_;
                  auVar180._8_4_ = fVar212 * fStack_a18;
                  auVar180._12_4_ = fVar212 * fStack_a14;
                  auVar213 = vfmadd213ps_fma(auVar107,auVar180,auVar279);
                  auVar6 = vshufps_avx(auVar180,auVar180,0xc9);
                  auVar7 = vshufps_avx(auVar279,auVar279,0xc9);
                  auVar181._0_4_ = auVar180._0_4_ * auVar7._0_4_;
                  auVar181._4_4_ = auVar180._4_4_ * auVar7._4_4_;
                  auVar181._8_4_ = auVar180._8_4_ * auVar7._8_4_;
                  auVar181._12_4_ = auVar180._12_4_ * auVar7._12_4_;
                  auVar104 = vfmsub231ps_fma(auVar181,auVar279,auVar6);
                  auVar6 = vshufps_avx(auVar104,auVar104,0xc9);
                  auVar7 = vshufps_avx(auVar213,auVar213,0xc9);
                  auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                  auVar110._0_4_ = auVar213._0_4_ * auVar104._0_4_;
                  auVar110._4_4_ = auVar213._4_4_ * auVar104._4_4_;
                  auVar110._8_4_ = auVar213._8_4_ * auVar104._8_4_;
                  auVar110._12_4_ = auVar213._12_4_ * auVar104._12_4_;
                  auVar6 = vfmsub231ps_fma(auVar110,auVar6,auVar7);
                  local_4a0 = auVar5._0_8_;
                  auVar5 = vmovshdup_avx(auVar6);
                  local_500._8_8_ = auVar5._0_8_;
                  auVar5 = vshufps_avx(auVar6,auVar6,0xaa);
                  local_4e0 = auVar5._0_8_;
                  local_4c0 = auVar6._0_4_;
                  local_500._0_8_ = local_500._8_8_;
                  local_500._16_8_ = local_500._8_8_;
                  local_500._24_8_ = local_500._8_8_;
                  uStack_4d8 = local_4e0;
                  uStack_4d0 = local_4e0;
                  uStack_4c8 = local_4e0;
                  uStack_4bc = local_4c0;
                  uStack_4b8 = local_4c0;
                  uStack_4b4 = local_4c0;
                  uStack_4b0 = local_4c0;
                  uStack_4ac = local_4c0;
                  uStack_4a8 = local_4c0;
                  uStack_4a4 = local_4c0;
                  uStack_498 = local_4a0;
                  uStack_490 = local_4a0;
                  uStack_488 = local_4a0;
                  auVar162._12_4_ = 0;
                  auVar162._0_12_ = ZEXT812(0);
                  auVar162 = auVar162 << 0x20;
                  local_480 = ZEXT1232(ZEXT812(0)) << 0x20;
                  local_460 = CONCAT44(uStack_75c,local_760);
                  uStack_458 = CONCAT44(uStack_754,uStack_758);
                  uStack_450 = CONCAT44(uStack_74c,uStack_750);
                  uStack_448 = CONCAT44(uStack_744,uStack_748);
                  local_440._4_4_ = uStack_73c;
                  local_440._0_4_ = local_740;
                  local_440._8_4_ = uStack_738;
                  local_440._12_4_ = uStack_734;
                  local_440._16_4_ = uStack_730;
                  local_440._20_4_ = uStack_72c;
                  local_440._24_4_ = uStack_728;
                  local_440._28_4_ = uStack_724;
                  vpcmpeqd_avx2(local_440,local_440);
                  local_420 = context->user->instID[0];
                  uStack_41c = local_420;
                  uStack_418 = local_420;
                  uStack_414 = local_420;
                  uStack_410 = local_420;
                  uStack_40c = local_420;
                  uStack_408 = local_420;
                  uStack_404 = local_420;
                  local_400 = context->user->instPrimID[0];
                  uStack_3fc = local_400;
                  uStack_3f8 = local_400;
                  uStack_3f4 = local_400;
                  uStack_3f0 = local_400;
                  uStack_3ec = local_400;
                  uStack_3e8 = local_400;
                  uStack_3e4 = local_400;
                  *(float *)(ray + k * 4 + 0x100) = fVar220;
                  local_9e0 = local_780;
                  local_ab0.valid = (int *)local_9e0;
                  local_ab0.geometryUserPtr = pGVar9->userPtr;
                  local_ab0.context = context->user;
                  local_ab0.hit = (RTCHitN *)local_500;
                  local_ab0.N = 8;
                  local_ab0.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar247 = ZEXT1664(auVar247._0_16_);
                    auVar254 = ZEXT1664(auVar254._0_16_);
                    (*pGVar9->occlusionFilterN)(&local_ab0);
                    auVar162 = ZEXT816(0) << 0x40;
                  }
                  auVar174 = ZEXT1632(auVar162);
                  auVar274 = vpcmpeqd_avx2(local_9e0,auVar174);
                  auVar274 = _DAT_01f7b020 & ~auVar274;
                  if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar274 >> 0x7f,0) != '\0') ||
                        (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar274 >> 0xbf,0) != '\0') ||
                      (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar274[0x1f] < '\0') {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var10)(&local_ab0);
                      auVar174 = ZEXT832(0) << 0x40;
                    }
                    auVar277 = ZEXT464((uint)fVar221);
                    auVar174 = vpcmpeqd_avx2(local_9e0,auVar174);
                    auVar149._8_4_ = 0xff800000;
                    auVar149._0_8_ = 0xff800000ff800000;
                    auVar149._12_4_ = 0xff800000;
                    auVar149._16_4_ = 0xff800000;
                    auVar149._20_4_ = 0xff800000;
                    auVar149._24_4_ = 0xff800000;
                    auVar149._28_4_ = 0xff800000;
                    auVar274 = vblendvps_avx(auVar149,*(undefined1 (*) [32])(local_ab0.ray + 0x100),
                                             auVar174);
                    *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar274;
                    auVar274 = _DAT_01f7b020 & ~auVar174;
                    if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar274 >> 0x7f,0) != '\0') ||
                          (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar274 >> 0xbf,0) != '\0') ||
                        (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar274[0x1f] < '\0') {
                      bVar90 = 1;
                      goto LAB_01347711;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar221;
                }
              }
              auVar277 = ZEXT464((uint)fVar221);
              bVar90 = 0;
              goto LAB_01347711;
            }
          }
        }
        bVar101 = false;
LAB_01347711:
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar267._4_4_ = uVar100;
        auVar267._0_4_ = uVar100;
        auVar267._8_4_ = uVar100;
        auVar267._12_4_ = uVar100;
        auVar267._16_4_ = uVar100;
        auVar267._20_4_ = uVar100;
        auVar267._24_4_ = uVar100;
        auVar267._28_4_ = uVar100;
        auVar269 = ZEXT3264(auVar267);
        bVar98 = bVar98 | bVar101 & bVar90;
        auVar274 = vcmpps_avx(_local_980,auVar267,2);
        local_560 = vandps_avx(auVar274,local_560);
      }
      auVar128._0_4_ = auVar119._0_4_ + fVar132;
      auVar128._4_4_ = auVar119._4_4_ + fVar132;
      auVar128._8_4_ = auVar119._8_4_ + fVar132;
      auVar128._12_4_ = auVar119._12_4_ + fVar132;
      auVar128._16_4_ = auVar119._16_4_ + fVar132;
      auVar128._20_4_ = auVar119._20_4_ + fVar132;
      auVar128._24_4_ = auVar119._24_4_ + fVar132;
      auVar128._28_4_ = auVar119._28_4_ + fVar132;
      uVar100 = auVar269._0_4_;
      auVar150._4_4_ = uVar100;
      auVar150._0_4_ = uVar100;
      auVar150._8_4_ = uVar100;
      auVar150._12_4_ = uVar100;
      auVar150._16_4_ = uVar100;
      auVar150._20_4_ = uVar100;
      auVar150._24_4_ = uVar100;
      auVar150._28_4_ = uVar100;
      auVar119 = vcmpps_avx(auVar128,auVar150,2);
      auVar115 = vandps_avx(auVar119,auVar115);
      auVar129._8_4_ = 3;
      auVar129._0_8_ = 0x300000003;
      auVar129._12_4_ = 3;
      auVar129._16_4_ = 3;
      auVar129._20_4_ = 3;
      auVar129._24_4_ = 3;
      auVar129._28_4_ = 3;
      auVar151._8_4_ = 2;
      auVar151._0_8_ = 0x200000002;
      auVar151._12_4_ = 2;
      auVar151._16_4_ = 2;
      auVar151._20_4_ = 2;
      auVar151._24_4_ = 2;
      auVar151._28_4_ = 2;
      auVar119 = vblendvps_avx(auVar151,auVar129,local_800);
      _local_980 = vpcmpgtd_avx2(auVar119,local_820);
      local_580 = vpandn_avx2(_local_980,auVar115);
      local_be0._4_4_ = fVar132 + (float)local_3e0._4_4_;
      local_be0._0_4_ = fVar132 + (float)local_3e0._0_4_;
      fStack_bd8 = fVar132 + fStack_3d8;
      fStack_bd4 = fVar132 + fStack_3d4;
      fStack_bd0 = fVar132 + fStack_3d0;
      fStack_bcc = fVar132 + fStack_3cc;
      fStack_bc8 = fVar132 + fStack_3c8;
      fStack_bc4 = fVar132 + fStack_3c4;
      while( true ) {
        if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_580 >> 0x7f,0) == '\0') &&
              (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_580 >> 0xbf,0) == '\0') &&
            (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_580[0x1f]) break;
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar152._16_4_ = 0x7f800000;
        auVar152._20_4_ = 0x7f800000;
        auVar152._24_4_ = 0x7f800000;
        auVar152._28_4_ = 0x7f800000;
        auVar119 = vblendvps_avx(auVar152,auVar274,local_580);
        auVar174 = vshufps_avx(auVar119,auVar119,0xb1);
        auVar174 = vminps_avx(auVar119,auVar174);
        auVar13 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar13);
        auVar13 = vpermpd_avx2(auVar174,0x4e);
        auVar174 = vminps_avx(auVar174,auVar13);
        auVar174 = vcmpps_avx(auVar119,auVar174,0);
        auVar13 = local_580 & auVar174;
        auVar119 = local_580;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar119 = vandps_avx(auVar174,local_580);
        }
        uVar92 = vmovmskps_avx(auVar119);
        iVar91 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar91 = iVar91 + 1;
        }
        uVar96 = (ulong)(uint)(iVar91 << 2);
        *(undefined4 *)(local_580 + uVar96) = 0;
        uVar92 = *(uint *)(local_1c0 + uVar96);
        uVar97 = *(uint *)(local_3c0 + uVar96);
        fVar212 = auVar12._0_4_;
        if ((float)local_a00._0_4_ < 0.0) {
          auVar254 = ZEXT1664(auVar254._0_16_);
          auVar277 = ZEXT1664(auVar277._0_16_);
          fVar212 = sqrtf((float)local_a00._0_4_);
          uVar96 = extraout_RAX_03;
        }
        auVar247 = ZEXT464(uVar97);
        auVar6 = vminps_avx(auVar2,auVar4);
        auVar5 = vmaxps_avx(auVar2,auVar4);
        auVar7 = vminps_avx(auVar3,auVar1);
        auVar104 = vminps_avx(auVar6,auVar7);
        auVar6 = vmaxps_avx(auVar3,auVar1);
        auVar7 = vmaxps_avx(auVar5,auVar6);
        local_8e0._8_4_ = 0x7fffffff;
        local_8e0._0_8_ = 0x7fffffff7fffffff;
        local_8e0._12_4_ = 0x7fffffff;
        auVar5 = vandps_avx(auVar104,local_8e0._0_16_);
        auVar6 = vandps_avx(auVar7,local_8e0._0_16_);
        auVar5 = vmaxps_avx(auVar5,auVar6);
        auVar6 = vmovshdup_avx(auVar5);
        auVar6 = vmaxss_avx(auVar6,auVar5);
        auVar5 = vshufpd_avx(auVar5,auVar5,1);
        auVar5 = vmaxss_avx(auVar5,auVar6);
        fVar220 = auVar5._0_4_ * 1.9073486e-06;
        local_900._0_4_ = fVar212 * 1.9073486e-06;
        local_940._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
        auVar5 = vinsertps_avx(ZEXT416(uVar97),ZEXT416(uVar92),0x10);
        for (uVar99 = 0; bVar90 = (byte)uVar96, uVar99 != 5; uVar99 = uVar99 + 1) {
          fVar225 = auVar5._0_4_;
          auVar111._4_4_ = fVar225;
          auVar111._0_4_ = fVar225;
          auVar111._8_4_ = fVar225;
          auVar111._12_4_ = fVar225;
          auVar104 = vfmadd213ps_fma(auVar111,local_9f0,_DAT_01f45a50);
          auVar7 = vmovshdup_avx(auVar5);
          fVar193 = auVar7._0_4_;
          fVar224 = 1.0 - fVar193;
          auVar107 = SUB6416(ZEXT464(0x40400000),0);
          auVar242 = SUB6416(ZEXT464(0xc0a00000),0);
          auVar213 = vfmadd213ss_fma(auVar107,auVar7,auVar242);
          auVar6 = vfmadd213ss_fma(auVar213,ZEXT416((uint)(fVar193 * fVar193)),
                                   SUB6416(ZEXT464(0x40000000),0));
          auVar160 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar224),auVar242);
          auVar160 = vfmadd213ss_fma(auVar160,ZEXT416((uint)(fVar224 * fVar224)),
                                     SUB6416(ZEXT464(0x40000000),0));
          fVar212 = fVar224 * fVar224 * -fVar193 * 0.5;
          fVar221 = auVar6._0_4_ * 0.5;
          fVar222 = auVar160._0_4_ * 0.5;
          fVar223 = fVar193 * fVar193 * -fVar224 * 0.5;
          auVar182._0_4_ = fVar223 * fVar175;
          auVar182._4_4_ = fVar223 * fStack_b3c;
          auVar182._8_4_ = fVar223 * fStack_b38;
          auVar182._12_4_ = fVar223 * fStack_b34;
          auVar200._4_4_ = fVar222;
          auVar200._0_4_ = fVar222;
          auVar200._8_4_ = fVar222;
          auVar200._12_4_ = fVar222;
          auVar6 = vfmadd132ps_fma(auVar200,auVar182,auVar3);
          auVar163._4_4_ = fVar221;
          auVar163._0_4_ = fVar221;
          auVar163._8_4_ = fVar221;
          auVar163._12_4_ = fVar221;
          auVar6 = vfmadd132ps_fma(auVar163,auVar6,auVar4);
          auVar183._4_4_ = fVar212;
          auVar183._0_4_ = fVar212;
          auVar183._8_4_ = fVar212;
          auVar183._12_4_ = fVar212;
          auVar6 = vfmadd132ps_fma(auVar183,auVar6,auVar2);
          auVar242 = vfmadd231ss_fma(auVar242,auVar7,ZEXT416(0x41100000));
          auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar7,ZEXT416(0x40800000));
          local_8c0._0_16_ = auVar6;
          auVar6 = vsubps_avx(auVar104,auVar6);
          _local_a20 = auVar6;
          auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
          auVar104 = vfmadd213ss_fma(auVar107,auVar7,ZEXT416(0xbf800000));
          fVar212 = auVar6._0_4_;
          if (fVar212 < 0.0) {
            local_a40._0_16_ = auVar242;
            local_a60._0_4_ = fVar224 * -2.0;
            auVar247._0_4_ = sqrtf(fVar212);
            auVar247._4_60_ = extraout_var_00;
            auVar213 = ZEXT416(auVar213._0_4_);
            auVar107 = auVar247._0_16_;
            uVar96 = extraout_RAX_04;
            fVar221 = (float)local_a60._0_4_;
            auVar242 = local_a40._0_16_;
          }
          else {
            auVar107 = vsqrtss_avx(auVar6,auVar6);
            fVar221 = fVar224 * -2.0;
          }
          auVar279 = vfmadd213ss_fma(auVar213,ZEXT416((uint)(fVar193 + fVar193)),
                                     ZEXT416((uint)(fVar193 * fVar193 * 3.0)));
          auVar163 = SUB6416(ZEXT464(0x40000000),0);
          auVar213 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar7,auVar163);
          auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224 * -3.0)),
                                     ZEXT416((uint)(fVar224 + fVar224)),auVar213);
          auVar111 = vfnmadd231ss_fma(ZEXT416((uint)(fVar193 * (fVar224 + fVar224))),
                                      ZEXT416((uint)fVar224),ZEXT416((uint)fVar224));
          auVar213 = vfmadd213ss_fma(ZEXT416((uint)fVar221),auVar7,
                                     ZEXT416((uint)(fVar193 * fVar193)));
          fVar221 = auVar105._0_4_ * 0.5;
          fVar222 = auVar213._0_4_ * 0.5;
          auVar164._0_4_ = fVar175 * fVar222;
          auVar164._4_4_ = fStack_b3c * fVar222;
          auVar164._8_4_ = fStack_b38 * fVar222;
          auVar164._12_4_ = fStack_b34 * fVar222;
          auVar137._4_4_ = fVar221;
          auVar137._0_4_ = fVar221;
          auVar137._8_4_ = fVar221;
          auVar137._12_4_ = fVar221;
          auVar213 = vfmadd213ps_fma(auVar137,auVar3,auVar164);
          fVar221 = auVar111._0_4_ * 0.5;
          fVar222 = auVar279._0_4_ * 0.5;
          auVar165._4_4_ = fVar222;
          auVar165._0_4_ = fVar222;
          auVar165._8_4_ = fVar222;
          auVar165._12_4_ = fVar222;
          auVar213 = vfmadd213ps_fma(auVar165,auVar4,auVar213);
          auVar265._4_4_ = fVar221;
          auVar265._0_4_ = fVar221;
          auVar265._8_4_ = fVar221;
          auVar265._12_4_ = fVar221;
          auVar279 = vfmadd213ps_fma(auVar265,auVar2,auVar213);
          auVar213 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0xc0400000),0),auVar163);
          local_b80 = auVar104._0_4_;
          auVar112._0_4_ = fVar175 * local_b80;
          auVar112._4_4_ = fStack_b3c * local_b80;
          auVar112._8_4_ = fStack_b38 * local_b80;
          auVar112._12_4_ = fStack_b34 * local_b80;
          local_ae0 = auVar160._0_4_;
          auVar138._4_4_ = local_ae0;
          auVar138._0_4_ = local_ae0;
          auVar138._8_4_ = local_ae0;
          auVar138._12_4_ = local_ae0;
          auVar7 = vfmadd213ps_fma(auVar138,auVar3,auVar112);
          uVar100 = auVar242._0_4_;
          auVar166._4_4_ = uVar100;
          auVar166._0_4_ = uVar100;
          auVar166._8_4_ = uVar100;
          auVar166._12_4_ = uVar100;
          auVar7 = vfmadd213ps_fma(auVar166,auVar4,auVar7);
          auVar104 = vdpps_avx(auVar279,auVar279,0x7f);
          uVar100 = auVar213._0_4_;
          auVar139._4_4_ = uVar100;
          auVar139._0_4_ = uVar100;
          auVar139._8_4_ = uVar100;
          auVar139._12_4_ = uVar100;
          auVar160 = vfmadd213ps_fma(auVar139,auVar2,auVar7);
          auVar7 = vblendps_avx(auVar104,_DAT_01f45a50,0xe);
          auVar213 = vrsqrtss_avx(auVar7,auVar7);
          fVar223 = auVar104._0_4_;
          fVar221 = auVar213._0_4_;
          auVar213 = vdpps_avx(auVar279,auVar160,0x7f);
          fVar221 = fVar221 * 1.5 + fVar223 * -0.5 * fVar221 * fVar221 * fVar221;
          auVar140._0_4_ = auVar160._0_4_ * fVar223;
          auVar140._4_4_ = auVar160._4_4_ * fVar223;
          auVar140._8_4_ = auVar160._8_4_ * fVar223;
          auVar140._12_4_ = auVar160._12_4_ * fVar223;
          fVar222 = auVar213._0_4_;
          auVar215._0_4_ = auVar279._0_4_ * fVar222;
          auVar215._4_4_ = auVar279._4_4_ * fVar222;
          fVar224 = auVar279._8_4_;
          auVar215._8_4_ = fVar224 * fVar222;
          fVar193 = auVar279._12_4_;
          auVar215._12_4_ = fVar193 * fVar222;
          auVar213 = vsubps_avx(auVar140,auVar215);
          auVar7 = vrcpss_avx(auVar7,auVar7);
          auVar160 = vfnmadd213ss_fma(auVar7,auVar104,auVar163);
          fVar222 = auVar7._0_4_ * auVar160._0_4_;
          auVar7 = vmaxss_avx(ZEXT416((uint)fVar220),
                              ZEXT416((uint)(fVar225 * (float)local_900._0_4_)));
          auVar269 = ZEXT1664(auVar7);
          auVar258._0_8_ = auVar279._0_8_ ^ 0x8000000080000000;
          auVar258._8_4_ = -fVar224;
          auVar258._12_4_ = -fVar193;
          auVar184._0_4_ = fVar221 * auVar213._0_4_ * fVar222;
          auVar184._4_4_ = fVar221 * auVar213._4_4_ * fVar222;
          auVar184._8_4_ = fVar221 * auVar213._8_4_ * fVar222;
          auVar184._12_4_ = fVar221 * auVar213._12_4_ * fVar222;
          auVar250._0_4_ = auVar279._0_4_ * fVar221;
          auVar250._4_4_ = auVar279._4_4_ * fVar221;
          auVar250._8_4_ = fVar224 * fVar221;
          auVar250._12_4_ = fVar193 * fVar221;
          if (fVar223 < -fVar223) {
            fVar221 = sqrtf(fVar223);
            auVar269 = ZEXT464(auVar7._0_4_);
            auVar107 = ZEXT416(auVar107._0_4_);
            uVar96 = extraout_RAX_05;
          }
          else {
            auVar104 = vsqrtss_avx(auVar104,auVar104);
            fVar221 = auVar104._0_4_;
          }
          auVar104 = vdpps_avx(_local_a20,auVar250,0x7f);
          auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar220),auVar107,auVar269._0_16_);
          auVar213 = vdpps_avx(auVar258,auVar250,0x7f);
          auVar160 = vdpps_avx(_local_a20,auVar184,0x7f);
          auVar242 = vdpps_avx(local_9f0,auVar250,0x7f);
          auVar105 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                     ZEXT416((uint)(fVar220 / fVar221)),auVar105);
          auVar254 = ZEXT1664(auVar105);
          fVar221 = auVar213._0_4_ + auVar160._0_4_;
          auVar277 = ZEXT464((uint)fVar221);
          fVar223 = auVar104._0_4_;
          auVar113._0_4_ = fVar223 * fVar223;
          auVar113._4_4_ = auVar104._4_4_ * auVar104._4_4_;
          auVar113._8_4_ = auVar104._8_4_ * auVar104._8_4_;
          auVar113._12_4_ = auVar104._12_4_ * auVar104._12_4_;
          auVar213 = vdpps_avx(_local_a20,auVar258,0x7f);
          auVar107 = vsubps_avx(auVar6,auVar113);
          auVar160 = vrsqrtss_avx(auVar107,auVar107);
          fVar224 = auVar107._0_4_;
          fVar222 = auVar160._0_4_;
          fVar222 = fVar222 * 1.5 + fVar224 * -0.5 * fVar222 * fVar222 * fVar222;
          auVar160 = vdpps_avx(_local_a20,local_9f0,0x7f);
          auVar213 = vfnmadd231ss_fma(auVar213,auVar104,ZEXT416((uint)fVar221));
          auVar160 = vfnmadd231ss_fma(auVar160,auVar104,auVar242);
          if (fVar224 < 0.0) {
            local_a40._0_16_ = auVar213;
            local_a60._0_4_ = fVar222;
            local_920._0_16_ = auVar160;
            fVar224 = sqrtf(fVar224);
            auVar277 = ZEXT1664(ZEXT416((uint)fVar221));
            auVar254 = ZEXT464(auVar105._0_4_);
            auVar269 = ZEXT464(auVar7._0_4_);
            uVar96 = extraout_RAX_06;
            fVar222 = (float)local_a60._0_4_;
            auVar160 = local_920._0_16_;
            auVar213 = local_a40._0_16_;
          }
          else {
            auVar7 = vsqrtss_avx(auVar107,auVar107);
            fVar224 = auVar7._0_4_;
          }
          auVar247 = ZEXT1664(auVar104);
          auVar7 = vpermilps_avx(local_8c0._0_16_,0xff);
          fVar224 = fVar224 - auVar7._0_4_;
          auVar107 = vshufps_avx(auVar279,auVar279,0xff);
          auVar7 = vfmsub213ss_fma(auVar213,ZEXT416((uint)fVar222),auVar107);
          auVar185._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
          auVar185._8_4_ = auVar242._8_4_ ^ 0x80000000;
          auVar185._12_4_ = auVar242._12_4_ ^ 0x80000000;
          auVar201._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
          auVar201._8_4_ = auVar7._8_4_ ^ 0x80000000;
          auVar201._12_4_ = auVar7._12_4_ ^ 0x80000000;
          auVar160 = ZEXT416((uint)(auVar160._0_4_ * fVar222));
          auVar213 = vfmsub231ss_fma(ZEXT416((uint)(auVar242._0_4_ * auVar7._0_4_)),auVar277._0_16_,
                                     auVar160);
          auVar7 = vinsertps_avx(auVar201,auVar160,0x1c);
          uVar100 = auVar213._0_4_;
          auVar202._4_4_ = uVar100;
          auVar202._0_4_ = uVar100;
          auVar202._8_4_ = uVar100;
          auVar202._12_4_ = uVar100;
          auVar7 = vdivps_avx(auVar7,auVar202);
          auVar213 = vinsertps_avx(auVar277._0_16_,auVar185,0x10);
          auVar213 = vdivps_avx(auVar213,auVar202);
          auVar167._0_4_ = fVar223 * auVar7._0_4_ + fVar224 * auVar213._0_4_;
          auVar167._4_4_ = fVar223 * auVar7._4_4_ + fVar224 * auVar213._4_4_;
          auVar167._8_4_ = fVar223 * auVar7._8_4_ + fVar224 * auVar213._8_4_;
          auVar167._12_4_ = fVar223 * auVar7._12_4_ + fVar224 * auVar213._12_4_;
          auVar5 = vsubps_avx(auVar5,auVar167);
          auVar7 = vandps_avx(auVar104,local_8e0._0_16_);
          if (auVar7._0_4_ < auVar254._0_4_) {
            auVar213 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ + auVar269._0_4_)),
                                       local_940._0_16_,ZEXT416(0x36000000));
            auVar7 = vandps_avx(ZEXT416((uint)fVar224),local_8e0._0_16_);
            if (auVar7._0_4_ < auVar213._0_4_) {
              bVar101 = uVar99 < 5;
              fVar220 = auVar5._0_4_ + (float)local_9b0._0_4_;
              if (fVar220 < fVar102) {
                bVar90 = 0;
                goto LAB_0134820e;
              }
              fVar221 = *(float *)(ray + k * 4 + 0x100);
              auVar277 = ZEXT464((uint)fVar221);
              if (fVar220 <= fVar221) {
                auVar5 = vmovshdup_avx(auVar5);
                bVar90 = 0;
                if ((auVar5._0_4_ < 0.0) || (1.0 < auVar5._0_4_)) goto LAB_0134820e;
                auVar6 = vrsqrtss_avx(auVar6,auVar6);
                fVar222 = auVar6._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar93].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar90 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_0134820e;
                  fVar212 = fVar222 * 1.5 + fVar212 * -0.5 * fVar222 * fVar222 * fVar222;
                  auVar186._0_4_ = fVar212 * (float)local_a20._0_4_;
                  auVar186._4_4_ = fVar212 * (float)local_a20._4_4_;
                  auVar186._8_4_ = fVar212 * fStack_a18;
                  auVar186._12_4_ = fVar212 * fStack_a14;
                  auVar160 = vfmadd213ps_fma(auVar107,auVar186,auVar279);
                  auVar6 = vshufps_avx(auVar186,auVar186,0xc9);
                  auVar7 = vshufps_avx(auVar279,auVar279,0xc9);
                  auVar187._0_4_ = auVar186._0_4_ * auVar7._0_4_;
                  auVar187._4_4_ = auVar186._4_4_ * auVar7._4_4_;
                  auVar187._8_4_ = auVar186._8_4_ * auVar7._8_4_;
                  auVar187._12_4_ = auVar186._12_4_ * auVar7._12_4_;
                  auVar213 = vfmsub231ps_fma(auVar187,auVar279,auVar6);
                  auVar6 = vshufps_avx(auVar213,auVar213,0xc9);
                  auVar7 = vshufps_avx(auVar160,auVar160,0xc9);
                  auVar213 = vshufps_avx(auVar213,auVar213,0xd2);
                  auVar114._0_4_ = auVar160._0_4_ * auVar213._0_4_;
                  auVar114._4_4_ = auVar160._4_4_ * auVar213._4_4_;
                  auVar114._8_4_ = auVar160._8_4_ * auVar213._8_4_;
                  auVar114._12_4_ = auVar160._12_4_ * auVar213._12_4_;
                  auVar6 = vfmsub231ps_fma(auVar114,auVar6,auVar7);
                  local_4a0 = auVar5._0_8_;
                  auVar5 = vmovshdup_avx(auVar6);
                  local_500._8_8_ = auVar5._0_8_;
                  auVar5 = vshufps_avx(auVar6,auVar6,0xaa);
                  local_4e0 = auVar5._0_8_;
                  local_4c0 = auVar6._0_4_;
                  local_500._0_8_ = local_500._8_8_;
                  local_500._16_8_ = local_500._8_8_;
                  local_500._24_8_ = local_500._8_8_;
                  uStack_4d8 = local_4e0;
                  uStack_4d0 = local_4e0;
                  uStack_4c8 = local_4e0;
                  uStack_4bc = local_4c0;
                  uStack_4b8 = local_4c0;
                  uStack_4b4 = local_4c0;
                  uStack_4b0 = local_4c0;
                  uStack_4ac = local_4c0;
                  uStack_4a8 = local_4c0;
                  uStack_4a4 = local_4c0;
                  uStack_498 = local_4a0;
                  uStack_490 = local_4a0;
                  uStack_488 = local_4a0;
                  auVar168._12_4_ = 0;
                  auVar168._0_12_ = ZEXT812(0);
                  auVar168 = auVar168 << 0x20;
                  local_480 = ZEXT1232(ZEXT812(0)) << 0x20;
                  local_460 = CONCAT44(uStack_75c,local_760);
                  uStack_458 = CONCAT44(uStack_754,uStack_758);
                  uStack_450 = CONCAT44(uStack_74c,uStack_750);
                  uStack_448 = CONCAT44(uStack_744,uStack_748);
                  local_440._4_4_ = uStack_73c;
                  local_440._0_4_ = local_740;
                  local_440._8_4_ = uStack_738;
                  local_440._12_4_ = uStack_734;
                  local_440._16_4_ = uStack_730;
                  local_440._20_4_ = uStack_72c;
                  local_440._24_4_ = uStack_728;
                  local_440._28_4_ = uStack_724;
                  vpcmpeqd_avx2(local_440,local_440);
                  local_420 = context->user->instID[0];
                  uStack_41c = local_420;
                  uStack_418 = local_420;
                  uStack_414 = local_420;
                  uStack_410 = local_420;
                  uStack_40c = local_420;
                  uStack_408 = local_420;
                  uStack_404 = local_420;
                  local_400 = context->user->instPrimID[0];
                  uStack_3fc = local_400;
                  uStack_3f8 = local_400;
                  uStack_3f4 = local_400;
                  uStack_3f0 = local_400;
                  uStack_3ec = local_400;
                  uStack_3e8 = local_400;
                  uStack_3e4 = local_400;
                  *(float *)(ray + k * 4 + 0x100) = fVar220;
                  local_9e0 = local_780;
                  local_ab0.valid = (int *)local_9e0;
                  local_ab0.geometryUserPtr = pGVar9->userPtr;
                  local_ab0.context = context->user;
                  local_ab0.hit = (RTCHitN *)local_500;
                  local_ab0.N = 8;
                  local_ab0.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar247 = ZEXT1664(auVar104);
                    auVar254 = ZEXT1664(auVar254._0_16_);
                    (*pGVar9->occlusionFilterN)(&local_ab0);
                    auVar168 = ZEXT816(0) << 0x40;
                  }
                  auVar174 = ZEXT1632(auVar168);
                  auVar119 = vpcmpeqd_avx2(local_9e0,auVar174);
                  auVar119 = _DAT_01f7b020 & ~auVar119;
                  if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar119 >> 0x7f,0) != '\0') ||
                        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar119 >> 0xbf,0) != '\0') ||
                      (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar119[0x1f] < '\0') {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var10)(&local_ab0);
                      auVar174 = ZEXT832(0) << 0x40;
                    }
                    auVar277 = ZEXT464((uint)fVar221);
                    auVar174 = vpcmpeqd_avx2(local_9e0,auVar174);
                    auVar153._8_4_ = 0xff800000;
                    auVar153._0_8_ = 0xff800000ff800000;
                    auVar153._12_4_ = 0xff800000;
                    auVar153._16_4_ = 0xff800000;
                    auVar153._20_4_ = 0xff800000;
                    auVar153._24_4_ = 0xff800000;
                    auVar153._28_4_ = 0xff800000;
                    auVar119 = vblendvps_avx(auVar153,*(undefined1 (*) [32])(local_ab0.ray + 0x100),
                                             auVar174);
                    *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar119;
                    auVar119 = _DAT_01f7b020 & ~auVar174;
                    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar119 >> 0x7f,0) != '\0') ||
                          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar119 >> 0xbf,0) != '\0') ||
                        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar119[0x1f] < '\0') {
                      bVar90 = 1;
                      goto LAB_0134820e;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar221;
                }
              }
              auVar277 = ZEXT464((uint)fVar221);
              bVar90 = 0;
              goto LAB_0134820e;
            }
          }
        }
        bVar101 = false;
LAB_0134820e:
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar268._4_4_ = uVar100;
        auVar268._0_4_ = uVar100;
        auVar268._8_4_ = uVar100;
        auVar268._12_4_ = uVar100;
        auVar268._16_4_ = uVar100;
        auVar268._20_4_ = uVar100;
        auVar268._24_4_ = uVar100;
        auVar268._28_4_ = uVar100;
        auVar269 = ZEXT3264(auVar268);
        bVar98 = bVar98 | bVar101 & bVar90;
        auVar119 = vcmpps_avx(_local_be0,auVar268,2);
        local_580 = vandps_avx(auVar119,local_580);
      }
      auVar154._0_4_ = fVar132 + local_540._0_4_;
      auVar154._4_4_ = fVar132 + local_540._4_4_;
      auVar154._8_4_ = fVar132 + local_540._8_4_;
      auVar154._12_4_ = fVar132 + local_540._12_4_;
      auVar154._16_4_ = fVar132 + local_540._16_4_;
      auVar154._20_4_ = fVar132 + local_540._20_4_;
      auVar154._24_4_ = fVar132 + local_540._24_4_;
      auVar154._28_4_ = fVar132 + local_540._28_4_;
      uVar100 = auVar269._0_4_;
      auVar191._4_4_ = uVar100;
      auVar191._0_4_ = uVar100;
      auVar191._8_4_ = uVar100;
      auVar191._12_4_ = uVar100;
      auVar191._16_4_ = uVar100;
      auVar191._20_4_ = uVar100;
      auVar191._24_4_ = uVar100;
      auVar191._28_4_ = uVar100;
      auVar119 = vcmpps_avx(auVar154,auVar191,2);
      auVar274 = vandps_avx(local_7e0,local_7c0);
      auVar274 = vandps_avx(auVar119,auVar274);
      auVar209._0_4_ = fVar132 + local_3e0._0_4_;
      auVar209._4_4_ = fVar132 + local_3e0._4_4_;
      auVar209._8_4_ = fVar132 + local_3e0._8_4_;
      auVar209._12_4_ = fVar132 + local_3e0._12_4_;
      auVar209._16_4_ = fVar132 + local_3e0._16_4_;
      auVar209._20_4_ = fVar132 + local_3e0._20_4_;
      auVar209._24_4_ = fVar132 + local_3e0._24_4_;
      auVar209._28_4_ = fVar132 + local_3e0._28_4_;
      auVar119 = vcmpps_avx(auVar209,auVar191,2);
      auVar115 = vandps_avx(_local_980,auVar115);
      auVar115 = vandps_avx(auVar119,auVar115);
      auVar115 = vorps_avx(auVar274,auVar115);
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar115;
        auVar115 = vblendvps_avx(_local_3e0,local_540,auVar274);
        *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar115;
        uVar96 = vmovlps_avx(local_790);
        (&uStack_140)[uVar94 * 0xc] = uVar96;
        aiStack_138[uVar94 * 0x18] = local_ce4 + 1;
        uVar94 = (ulong)((int)uVar94 + 1);
      }
      auVar269 = ZEXT3264(local_a80);
      auVar211 = ZEXT3264(_DAT_01f7b040);
    }
    while( true ) {
      auVar234 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar132,CONCAT420(fVar132,CONCAT416(fVar132,
                                                  auVar227)))));
      uVar92 = (uint)uVar94;
      if (uVar92 == 0) {
        if (bVar98 != 0) goto LAB_01348732;
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar131._4_4_ = uVar100;
        auVar131._0_4_ = uVar100;
        auVar131._8_4_ = uVar100;
        auVar131._12_4_ = uVar100;
        auVar131._16_4_ = uVar100;
        auVar131._20_4_ = uVar100;
        auVar131._24_4_ = uVar100;
        auVar131._28_4_ = uVar100;
        auVar115 = vcmpps_avx(local_340,auVar131,2);
        uVar93 = vmovmskps_avx(auVar115);
        local_988 = (ulong)((uint)local_990 & uVar93);
        goto LAB_01345e2d;
      }
      uVar94 = (ulong)(uVar92 - 1);
      lVar95 = uVar94 * 0x60;
      auVar115 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar126._0_4_ = fVar132 + auVar115._0_4_;
      auVar126._4_4_ = fVar132 + auVar115._4_4_;
      auVar126._8_4_ = fVar132 + auVar115._8_4_;
      auVar126._12_4_ = fVar132 + auVar115._12_4_;
      auVar126._16_4_ = fVar132 + auVar115._16_4_;
      auVar126._20_4_ = fVar132 + auVar115._20_4_;
      auVar126._24_4_ = fVar132 + auVar115._24_4_;
      auVar126._28_4_ = fVar132 + auVar115._28_4_;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar189._4_4_ = uVar100;
      auVar189._0_4_ = uVar100;
      auVar189._8_4_ = uVar100;
      auVar189._12_4_ = uVar100;
      auVar189._16_4_ = uVar100;
      auVar189._20_4_ = uVar100;
      auVar189._24_4_ = uVar100;
      auVar189._28_4_ = uVar100;
      auVar119 = vcmpps_avx(auVar126,auVar189,2);
      auVar274 = vandps_avx(auVar119,*(undefined1 (*) [32])(auStack_180 + lVar95));
      local_500 = auVar274;
      auVar119 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar119;
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0x7f,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0xbf,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar119[0x1f] < '\0') break;
      uVar94 = (ulong)(uVar92 - 1);
    }
    auVar172._8_4_ = 0x7f800000;
    auVar172._0_8_ = 0x7f8000007f800000;
    auVar172._12_4_ = 0x7f800000;
    auVar172._16_4_ = 0x7f800000;
    auVar172._20_4_ = 0x7f800000;
    auVar172._24_4_ = 0x7f800000;
    auVar172._28_4_ = 0x7f800000;
    auVar115 = vblendvps_avx(auVar172,auVar115,auVar274);
    auVar119 = vshufps_avx(auVar115,auVar115,0xb1);
    auVar119 = vminps_avx(auVar115,auVar119);
    auVar174 = vshufpd_avx(auVar119,auVar119,5);
    auVar119 = vminps_avx(auVar119,auVar174);
    auVar174 = vpermpd_avx2(auVar119,0x4e);
    auVar119 = vminps_avx(auVar119,auVar174);
    auVar115 = vcmpps_avx(auVar115,auVar119,0);
    auVar119 = auVar274 & auVar115;
    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0x7f,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar119 >> 0xbf,0) != '\0') ||
        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar119[0x1f] < '\0') {
      auVar274 = vandps_avx(auVar115,auVar274);
    }
    uVar97 = vmovmskps_avx(auVar274);
    iVar91 = 0;
    for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
      iVar91 = iVar91 + 1;
    }
    *(undefined4 *)(local_500 + (uint)(iVar91 << 2)) = 0;
    uVar96 = (&uStack_140)[uVar94 * 0xc];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar96;
    local_ce4 = aiStack_138[uVar94 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar95) = local_500;
    uVar97 = uVar92 - 1;
    if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_500 >> 0x7f,0) != '\0') ||
          (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_500 >> 0xbf,0) != '\0') ||
        (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_500[0x1f] < '\0') {
      uVar97 = uVar92;
    }
    uVar100 = (undefined4)uVar96;
    auVar146._4_4_ = uVar100;
    auVar146._0_4_ = uVar100;
    auVar146._8_4_ = uVar100;
    auVar146._12_4_ = uVar100;
    auVar146._16_4_ = uVar100;
    auVar146._20_4_ = uVar100;
    auVar146._24_4_ = uVar100;
    auVar146._28_4_ = uVar100;
    auVar5 = vmovshdup_avx(auVar105);
    auVar5 = vsubps_avx(auVar5,auVar105);
    auVar127._0_4_ = auVar5._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    auVar5 = vfmadd132ps_fma(auVar127,auVar146,auVar211._0_32_);
    local_540 = ZEXT1632(auVar5);
    auVar155 = ZEXT864(*(ulong *)(local_540 + (uint)(iVar91 << 2)));
    uVar94 = (ulong)uVar97;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }